

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [28];
  float *pfVar7;
  uint uVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  uint uVar19;
  Geometry *pGVar20;
  RTCFilterFunctionN p_Var21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined1 auVar102 [28];
  undefined1 auVar103 [32];
  uint uVar104;
  int iVar105;
  uint uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  long lVar110;
  undefined4 uVar111;
  undefined8 uVar112;
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar114 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined8 uVar130;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar146 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar159 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar183;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined4 uVar192;
  float fVar193;
  undefined8 uVar194;
  float fVar200;
  float fVar201;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar215 [64];
  undefined4 uVar216;
  float fVar217;
  float fVar220;
  float fVar221;
  undefined1 auVar218 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar219 [64];
  float fVar226;
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar232;
  undefined1 in_ZMM12 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar233 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [32];
  undefined1 (*local_7c8) [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  LinearSpace3fa *local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [32];
  float local_5a0;
  uint uStack_59c;
  uint uStack_598;
  uint uStack_594;
  uint uStack_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  int local_3c0;
  int local_3bc;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  
  PVar18 = prim[1];
  uVar109 = (ulong)(byte)PVar18;
  fVar217 = *(float *)(prim + uVar109 * 0x19 + 0x12);
  auVar168 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar168 = vinsertps_avx(auVar168,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar22 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar168 = vsubps_avx(auVar168,*(undefined1 (*) [16])(prim + uVar109 * 0x19 + 6));
  auVar113._0_4_ = fVar217 * auVar168._0_4_;
  auVar113._4_4_ = fVar217 * auVar168._4_4_;
  auVar113._8_4_ = fVar217 * auVar168._8_4_;
  auVar113._12_4_ = fVar217 * auVar168._12_4_;
  auVar195._0_4_ = fVar217 * auVar22._0_4_;
  auVar195._4_4_ = fVar217 * auVar22._4_4_;
  auVar195._8_4_ = fVar217 * auVar22._8_4_;
  auVar195._12_4_ = fVar217 * auVar22._12_4_;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar109 * 4 + 6);
  auVar125 = vpmovsxbd_avx2(auVar168);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar109 * 5 + 6);
  auVar127 = vpmovsxbd_avx2(auVar22);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar109 * 6 + 6);
  auVar182 = vpmovsxbd_avx2(auVar11);
  auVar182 = vcvtdq2ps_avx(auVar182);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar109 * 0xb + 6);
  auVar123 = vpmovsxbd_avx2(auVar12);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar18 * 0xc) + 6);
  auVar136 = vpmovsxbd_avx2(auVar13);
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (uint)(byte)PVar18 * 0xc + uVar109 + 6);
  auVar25 = vpmovsxbd_avx2(auVar14);
  auVar25 = vcvtdq2ps_avx(auVar25);
  uVar107 = (ulong)(uint)((int)(uVar109 * 9) * 2);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar107 + 6);
  auVar158 = vpmovsxbd_avx2(auVar15);
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar107 + uVar109 + 6);
  auVar26 = vpmovsxbd_avx2(auVar16);
  auVar26 = vcvtdq2ps_avx(auVar26);
  uVar107 = (ulong)(uint)((int)(uVar109 * 5) << 2);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar107 + 6);
  auVar27 = vpmovsxbd_avx2(auVar17);
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar238._4_4_ = auVar195._0_4_;
  auVar238._0_4_ = auVar195._0_4_;
  auVar238._8_4_ = auVar195._0_4_;
  auVar238._12_4_ = auVar195._0_4_;
  auVar238._16_4_ = auVar195._0_4_;
  auVar238._20_4_ = auVar195._0_4_;
  auVar238._24_4_ = auVar195._0_4_;
  auVar238._28_4_ = auVar195._0_4_;
  auVar168 = vmovshdup_avx(auVar195);
  uVar194 = auVar168._0_8_;
  auVar243._8_8_ = uVar194;
  auVar243._0_8_ = uVar194;
  auVar243._16_8_ = uVar194;
  auVar243._24_8_ = uVar194;
  auVar168 = vshufps_avx(auVar195,auVar195,0xaa);
  fVar217 = auVar168._0_4_;
  auVar230._0_4_ = fVar217 * auVar182._0_4_;
  fVar220 = auVar168._4_4_;
  auVar230._4_4_ = fVar220 * auVar182._4_4_;
  auVar230._8_4_ = fVar217 * auVar182._8_4_;
  auVar230._12_4_ = fVar220 * auVar182._12_4_;
  auVar230._16_4_ = fVar217 * auVar182._16_4_;
  auVar230._20_4_ = fVar220 * auVar182._20_4_;
  auVar230._28_36_ = in_ZMM12._28_36_;
  auVar230._24_4_ = fVar217 * auVar182._24_4_;
  auVar219._0_4_ = auVar25._0_4_ * fVar217;
  auVar219._4_4_ = auVar25._4_4_ * fVar220;
  auVar219._8_4_ = auVar25._8_4_ * fVar217;
  auVar219._12_4_ = auVar25._12_4_ * fVar220;
  auVar219._16_4_ = auVar25._16_4_ * fVar217;
  auVar219._20_4_ = auVar25._20_4_ * fVar220;
  auVar219._28_36_ = in_ZMM10._28_36_;
  auVar219._24_4_ = auVar25._24_4_ * fVar217;
  auVar208._0_4_ = auVar27._0_4_ * fVar217;
  auVar208._4_4_ = auVar27._4_4_ * fVar220;
  auVar208._8_4_ = auVar27._8_4_ * fVar217;
  auVar208._12_4_ = auVar27._12_4_ * fVar220;
  auVar208._16_4_ = auVar27._16_4_ * fVar217;
  auVar208._20_4_ = auVar27._20_4_ * fVar220;
  auVar208._24_4_ = auVar27._24_4_ * fVar217;
  auVar208._28_4_ = 0;
  auVar168 = vfmadd231ps_fma(auVar230._0_32_,auVar243,auVar127);
  auVar22 = vfmadd231ps_fma(auVar219._0_32_,auVar243,auVar136);
  auVar11 = vfmadd231ps_fma(auVar208,auVar26,auVar243);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar238,auVar125);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar238,auVar123);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar158,auVar238);
  auVar239._4_4_ = auVar113._0_4_;
  auVar239._0_4_ = auVar113._0_4_;
  auVar239._8_4_ = auVar113._0_4_;
  auVar239._12_4_ = auVar113._0_4_;
  auVar239._16_4_ = auVar113._0_4_;
  auVar239._20_4_ = auVar113._0_4_;
  auVar239._24_4_ = auVar113._0_4_;
  auVar239._28_4_ = auVar113._0_4_;
  auVar168 = vmovshdup_avx(auVar113);
  uVar194 = auVar168._0_8_;
  auVar244._8_8_ = uVar194;
  auVar244._0_8_ = uVar194;
  auVar244._16_8_ = uVar194;
  auVar244._24_8_ = uVar194;
  auVar168 = vshufps_avx(auVar113,auVar113,0xaa);
  fVar217 = auVar168._0_4_;
  auVar198._0_4_ = fVar217 * auVar182._0_4_;
  fVar220 = auVar168._4_4_;
  auVar198._4_4_ = fVar220 * auVar182._4_4_;
  auVar198._8_4_ = fVar217 * auVar182._8_4_;
  auVar198._12_4_ = fVar220 * auVar182._12_4_;
  auVar198._16_4_ = fVar217 * auVar182._16_4_;
  auVar198._20_4_ = fVar220 * auVar182._20_4_;
  auVar198._24_4_ = fVar217 * auVar182._24_4_;
  auVar198._28_4_ = 0;
  auVar24._4_4_ = auVar25._4_4_ * fVar220;
  auVar24._0_4_ = auVar25._0_4_ * fVar217;
  auVar24._8_4_ = auVar25._8_4_ * fVar217;
  auVar24._12_4_ = auVar25._12_4_ * fVar220;
  auVar24._16_4_ = auVar25._16_4_ * fVar217;
  auVar24._20_4_ = auVar25._20_4_ * fVar220;
  auVar24._24_4_ = auVar25._24_4_ * fVar217;
  auVar24._28_4_ = auVar182._28_4_;
  auVar182._4_4_ = auVar27._4_4_ * fVar220;
  auVar182._0_4_ = auVar27._0_4_ * fVar217;
  auVar182._8_4_ = auVar27._8_4_ * fVar217;
  auVar182._12_4_ = auVar27._12_4_ * fVar220;
  auVar182._16_4_ = auVar27._16_4_ * fVar217;
  auVar182._20_4_ = auVar27._20_4_ * fVar220;
  auVar182._24_4_ = auVar27._24_4_ * fVar217;
  auVar182._28_4_ = fVar220;
  auVar168 = vfmadd231ps_fma(auVar198,auVar244,auVar127);
  auVar13 = vfmadd231ps_fma(auVar24,auVar244,auVar136);
  auVar14 = vfmadd231ps_fma(auVar182,auVar244,auVar26);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar239,auVar125);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar239,auVar123);
  local_2c0._8_4_ = 0x7fffffff;
  local_2c0._0_8_ = 0x7fffffff7fffffff;
  local_2c0._12_4_ = 0x7fffffff;
  local_2c0._16_4_ = 0x7fffffff;
  local_2c0._20_4_ = 0x7fffffff;
  local_2c0._24_4_ = 0x7fffffff;
  local_2c0._28_4_ = 0x7fffffff;
  auVar155._8_4_ = 0x219392ef;
  auVar155._0_8_ = 0x219392ef219392ef;
  auVar155._12_4_ = 0x219392ef;
  auVar155._16_4_ = 0x219392ef;
  auVar155._20_4_ = 0x219392ef;
  auVar155._24_4_ = 0x219392ef;
  auVar155._28_4_ = 0x219392ef;
  auVar125 = vandps_avx(ZEXT1632(auVar12),local_2c0);
  auVar125 = vcmpps_avx(auVar125,auVar155,1);
  auVar127 = vblendvps_avx(ZEXT1632(auVar12),auVar155,auVar125);
  auVar125 = vandps_avx(ZEXT1632(auVar22),local_2c0);
  auVar125 = vcmpps_avx(auVar125,auVar155,1);
  auVar182 = vblendvps_avx(ZEXT1632(auVar22),auVar155,auVar125);
  auVar125 = vandps_avx(ZEXT1632(auVar11),local_2c0);
  auVar125 = vcmpps_avx(auVar125,auVar155,1);
  auVar125 = vblendvps_avx(ZEXT1632(auVar11),auVar155,auVar125);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar239,auVar158);
  auVar123 = vrcpps_avx(auVar127);
  auVar177._8_4_ = 0x3f800000;
  auVar177._0_8_ = 0x3f8000003f800000;
  auVar177._12_4_ = 0x3f800000;
  auVar177._16_4_ = 0x3f800000;
  auVar177._20_4_ = 0x3f800000;
  auVar177._24_4_ = 0x3f800000;
  auVar177._28_4_ = 0x3f800000;
  auVar168 = vfnmadd213ps_fma(auVar127,auVar123,auVar177);
  auVar168 = vfmadd132ps_fma(ZEXT1632(auVar168),auVar123,auVar123);
  auVar127 = vrcpps_avx(auVar182);
  auVar22 = vfnmadd213ps_fma(auVar182,auVar127,auVar177);
  auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar127,auVar127);
  auVar127 = vrcpps_avx(auVar125);
  auVar11 = vfnmadd213ps_fma(auVar125,auVar127,auVar177);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar127,auVar127);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar109 * 7 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,ZEXT1632(auVar15));
  auVar123._4_4_ = auVar168._4_4_ * auVar125._4_4_;
  auVar123._0_4_ = auVar168._0_4_ * auVar125._0_4_;
  auVar123._8_4_ = auVar168._8_4_ * auVar125._8_4_;
  auVar123._12_4_ = auVar168._12_4_ * auVar125._12_4_;
  auVar123._16_4_ = auVar125._16_4_ * 0.0;
  auVar123._20_4_ = auVar125._20_4_ * 0.0;
  auVar123._24_4_ = auVar125._24_4_ * 0.0;
  auVar123._28_4_ = auVar125._28_4_;
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar109 * 9 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,ZEXT1632(auVar15));
  auVar136._4_4_ = auVar168._4_4_ * auVar125._4_4_;
  auVar136._0_4_ = auVar168._0_4_ * auVar125._0_4_;
  auVar136._8_4_ = auVar168._8_4_ * auVar125._8_4_;
  auVar136._12_4_ = auVar168._12_4_ * auVar125._12_4_;
  auVar136._16_4_ = auVar125._16_4_ * 0.0;
  auVar136._20_4_ = auVar125._20_4_ * 0.0;
  auVar136._24_4_ = auVar125._24_4_ * 0.0;
  auVar136._28_4_ = auVar125._28_4_;
  auVar131._1_3_ = 0;
  auVar131[0] = PVar18;
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar18 * 0x10 + 6));
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar18 * 0x10 + uVar109 * -2 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,ZEXT1632(auVar13));
  auVar25._4_4_ = auVar125._4_4_ * auVar22._4_4_;
  auVar25._0_4_ = auVar125._0_4_ * auVar22._0_4_;
  auVar25._8_4_ = auVar125._8_4_ * auVar22._8_4_;
  auVar25._12_4_ = auVar125._12_4_ * auVar22._12_4_;
  auVar25._16_4_ = auVar125._16_4_ * 0.0;
  auVar25._20_4_ = auVar125._20_4_ * 0.0;
  auVar25._24_4_ = auVar125._24_4_ * 0.0;
  auVar25._28_4_ = auVar125._28_4_;
  auVar125 = vcvtdq2ps_avx(auVar127);
  auVar125 = vsubps_avx(auVar125,ZEXT1632(auVar13));
  auVar158._4_4_ = auVar22._4_4_ * auVar125._4_4_;
  auVar158._0_4_ = auVar22._0_4_ * auVar125._0_4_;
  auVar158._8_4_ = auVar22._8_4_ * auVar125._8_4_;
  auVar158._12_4_ = auVar22._12_4_ * auVar125._12_4_;
  auVar158._16_4_ = auVar125._16_4_ * 0.0;
  auVar158._20_4_ = auVar125._20_4_ * 0.0;
  auVar158._24_4_ = auVar125._24_4_ * 0.0;
  auVar158._28_4_ = auVar125._28_4_;
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 + uVar109 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,ZEXT1632(auVar12));
  auVar26._4_4_ = auVar125._4_4_ * auVar11._4_4_;
  auVar26._0_4_ = auVar125._0_4_ * auVar11._0_4_;
  auVar26._8_4_ = auVar125._8_4_ * auVar11._8_4_;
  auVar26._12_4_ = auVar125._12_4_ * auVar11._12_4_;
  auVar26._16_4_ = auVar125._16_4_ * 0.0;
  auVar26._20_4_ = auVar125._20_4_ * 0.0;
  auVar26._24_4_ = auVar125._24_4_ * 0.0;
  auVar26._28_4_ = auVar125._28_4_;
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar109 * 0x17 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,ZEXT1632(auVar12));
  auVar27._4_4_ = auVar11._4_4_ * auVar125._4_4_;
  auVar27._0_4_ = auVar11._0_4_ * auVar125._0_4_;
  auVar27._8_4_ = auVar11._8_4_ * auVar125._8_4_;
  auVar27._12_4_ = auVar11._12_4_ * auVar125._12_4_;
  auVar27._16_4_ = auVar125._16_4_ * 0.0;
  auVar27._20_4_ = auVar125._20_4_ * 0.0;
  auVar27._24_4_ = auVar125._24_4_ * 0.0;
  auVar27._28_4_ = auVar125._28_4_;
  auVar125 = vpminsd_avx2(auVar123,auVar136);
  auVar127 = vpminsd_avx2(auVar25,auVar158);
  auVar125 = vmaxps_avx(auVar125,auVar127);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar188._4_4_ = uVar111;
  auVar188._0_4_ = uVar111;
  auVar188._8_4_ = uVar111;
  auVar188._12_4_ = uVar111;
  auVar188._16_4_ = uVar111;
  auVar188._20_4_ = uVar111;
  auVar188._24_4_ = uVar111;
  auVar188._28_4_ = uVar111;
  auVar127 = vpminsd_avx2(auVar26,auVar27);
  auVar127 = vmaxps_avx(auVar127,auVar188);
  auVar125 = vmaxps_avx(auVar125,auVar127);
  local_80._4_4_ = auVar125._4_4_ * 0.99999964;
  local_80._0_4_ = auVar125._0_4_ * 0.99999964;
  local_80._8_4_ = auVar125._8_4_ * 0.99999964;
  local_80._12_4_ = auVar125._12_4_ * 0.99999964;
  local_80._16_4_ = auVar125._16_4_ * 0.99999964;
  local_80._20_4_ = auVar125._20_4_ * 0.99999964;
  local_80._24_4_ = auVar125._24_4_ * 0.99999964;
  local_80._28_4_ = auVar127._28_4_;
  auVar125 = vpmaxsd_avx2(auVar123,auVar136);
  auVar127 = vpmaxsd_avx2(auVar25,auVar158);
  auVar125 = vminps_avx(auVar125,auVar127);
  auVar127 = vpmaxsd_avx2(auVar26,auVar27);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar126._4_4_ = uVar111;
  auVar126._0_4_ = uVar111;
  auVar126._8_4_ = uVar111;
  auVar126._12_4_ = uVar111;
  auVar126._16_4_ = uVar111;
  auVar126._20_4_ = uVar111;
  auVar126._24_4_ = uVar111;
  auVar126._28_4_ = uVar111;
  auVar127 = vminps_avx(auVar127,auVar126);
  auVar125 = vminps_avx(auVar125,auVar127);
  auVar117._4_4_ = auVar125._4_4_ * 1.0000004;
  auVar117._0_4_ = auVar125._0_4_ * 1.0000004;
  auVar117._8_4_ = auVar125._8_4_ * 1.0000004;
  auVar117._12_4_ = auVar125._12_4_ * 1.0000004;
  auVar117._16_4_ = auVar125._16_4_ * 1.0000004;
  auVar117._20_4_ = auVar125._20_4_ * 1.0000004;
  auVar117._24_4_ = auVar125._24_4_ * 1.0000004;
  auVar117._28_4_ = auVar125._28_4_;
  auVar131[4] = PVar18;
  auVar131._5_3_ = 0;
  auVar131[8] = PVar18;
  auVar131._9_3_ = 0;
  auVar131[0xc] = PVar18;
  auVar131._13_3_ = 0;
  auVar131[0x10] = PVar18;
  auVar131._17_3_ = 0;
  auVar131[0x14] = PVar18;
  auVar131._21_3_ = 0;
  auVar131[0x18] = PVar18;
  auVar131._25_3_ = 0;
  auVar131[0x1c] = PVar18;
  auVar131._29_3_ = 0;
  auVar127 = vpcmpgtd_avx2(auVar131,_DAT_01fe9900);
  auVar125 = vcmpps_avx(local_80,auVar117,2);
  auVar125 = vandps_avx(auVar125,auVar127);
  uVar104 = vmovmskps_avx(auVar125);
  if (uVar104 != 0) {
    uVar104 = uVar104 & 0xff;
    local_648 = pre->ray_space + k;
    local_640 = mm_lookupmask_ps._16_8_;
    uStack_638 = mm_lookupmask_ps._24_8_;
    uStack_630 = mm_lookupmask_ps._16_8_;
    uStack_628 = mm_lookupmask_ps._24_8_;
    local_7c8 = (undefined1 (*) [32])&local_1a0;
    iVar105 = 1 << ((uint)k & 0x1f);
    auVar125._4_4_ = iVar105;
    auVar125._0_4_ = iVar105;
    auVar125._8_4_ = iVar105;
    auVar125._12_4_ = iVar105;
    auVar125._16_4_ = iVar105;
    auVar125._20_4_ = iVar105;
    auVar125._24_4_ = iVar105;
    auVar125._28_4_ = iVar105;
    auVar127 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar125 = vpand_avx2(auVar125,auVar127);
    local_2e0 = vpcmpeqd_avx2(auVar125,auVar127);
    local_430 = 0x7fffffff;
    uStack_42c = 0x7fffffff;
    uStack_428 = 0x7fffffff;
    uStack_424 = 0x7fffffff;
    do {
      lVar28 = 0;
      uVar109 = (ulong)uVar104;
      for (uVar107 = uVar109; (uVar107 & 1) == 0; uVar107 = uVar107 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar104 = *(uint *)(prim + 2);
      uVar19 = *(uint *)(prim + lVar28 * 4 + 6);
      pGVar20 = (context->scene->geometries).items[uVar104].ptr;
      uVar107 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                                pGVar20[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar19);
      p_Var21 = pGVar20[1].intersectionFilterN;
      lVar28 = *(long *)&pGVar20[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar28 + (long)p_Var21 * uVar107);
      uVar194 = *(undefined8 *)*pauVar1;
      uVar95 = *(undefined8 *)(*pauVar1 + 8);
      auVar17 = *pauVar1;
      auVar14 = *pauVar1;
      auVar11 = *pauVar1;
      pauVar2 = (undefined1 (*) [16])(lVar28 + (uVar107 + 1) * (long)p_Var21);
      uVar96 = *(undefined8 *)*pauVar2;
      uVar97 = *(undefined8 *)(*pauVar2 + 8);
      auVar16 = *pauVar2;
      auVar13 = *pauVar2;
      auVar22 = *pauVar2;
      pauVar3 = (undefined1 (*) [16])(lVar28 + (uVar107 + 2) * (long)p_Var21);
      uVar98 = *(undefined8 *)*pauVar3;
      uVar99 = *(undefined8 *)(*pauVar3 + 8);
      auVar15 = *pauVar3;
      auVar12 = *pauVar3;
      auVar168 = *pauVar3;
      uVar109 = uVar109 - 1 & uVar109;
      pauVar4 = (undefined1 (*) [12])(lVar28 + (uVar107 + 3) * (long)p_Var21);
      uVar100 = *(undefined8 *)*pauVar4;
      uVar101 = *(undefined8 *)(*pauVar4 + 8);
      local_8e0 = (float)uVar100;
      fStack_8dc = (float)((ulong)uVar100 >> 0x20);
      fStack_8d8 = (float)uVar101;
      fStack_8d4 = (float)((ulong)uVar101 >> 0x20);
      if (uVar109 != 0) {
        uVar108 = uVar109 - 1 & uVar109;
        for (uVar107 = uVar109; (uVar107 & 1) == 0; uVar107 = uVar107 >> 1 | 0x8000000000000000) {
        }
        if (uVar108 != 0) {
          for (; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar105 = (int)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar113 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar115 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar195 = vsubps_avx(*pauVar1,auVar115);
      uVar111 = auVar195._0_4_;
      auVar165._4_4_ = uVar111;
      auVar165._0_4_ = uVar111;
      auVar165._8_4_ = uVar111;
      auVar165._12_4_ = uVar111;
      auVar113 = vshufps_avx(auVar195,auVar195,0x55);
      auVar195 = vshufps_avx(auVar195,auVar195,0xaa);
      aVar9 = (local_648->vx).field_0;
      aVar10 = (local_648->vy).field_0;
      fVar217 = (local_648->vz).field_0.m128[0];
      fVar220 = *(float *)((long)&(local_648->vz).field_0 + 4);
      fVar221 = *(float *)((long)&(local_648->vz).field_0 + 8);
      fVar222 = *(float *)((long)&(local_648->vz).field_0 + 0xc);
      auVar184._0_4_ = fVar217 * auVar195._0_4_;
      auVar184._4_4_ = fVar220 * auVar195._4_4_;
      auVar184._8_4_ = fVar221 * auVar195._8_4_;
      auVar184._12_4_ = fVar222 * auVar195._12_4_;
      auVar113 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar10,auVar113);
      auVar184 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar9,auVar165);
      auVar113 = vblendps_avx(auVar184,*pauVar1,8);
      auVar23 = vsubps_avx(*pauVar2,auVar115);
      uVar111 = auVar23._0_4_;
      auVar185._4_4_ = uVar111;
      auVar185._0_4_ = uVar111;
      auVar185._8_4_ = uVar111;
      auVar185._12_4_ = uVar111;
      auVar195 = vshufps_avx(auVar23,auVar23,0x55);
      auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar212._0_4_ = fVar217 * auVar23._0_4_;
      auVar212._4_4_ = fVar220 * auVar23._4_4_;
      auVar212._8_4_ = fVar221 * auVar23._8_4_;
      auVar212._12_4_ = fVar222 * auVar23._12_4_;
      auVar195 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar10,auVar195);
      auVar185 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar9,auVar185);
      auVar195 = vblendps_avx(auVar185,*pauVar2,8);
      auVar165 = vsubps_avx(*pauVar3,auVar115);
      uVar111 = auVar165._0_4_;
      auVar196._4_4_ = uVar111;
      auVar196._0_4_ = uVar111;
      auVar196._8_4_ = uVar111;
      auVar196._12_4_ = uVar111;
      auVar23 = vshufps_avx(auVar165,auVar165,0x55);
      auVar165 = vshufps_avx(auVar165,auVar165,0xaa);
      auVar218._0_4_ = fVar217 * auVar165._0_4_;
      auVar218._4_4_ = fVar220 * auVar165._4_4_;
      auVar218._8_4_ = fVar221 * auVar165._8_4_;
      auVar218._12_4_ = fVar222 * auVar165._12_4_;
      auVar23 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar10,auVar23);
      auVar196 = vfmadd231ps_fma(auVar23,(undefined1  [16])aVar9,auVar196);
      auVar23 = vblendps_avx(auVar196,*pauVar3,8);
      auVar29._12_4_ = fStack_8d4;
      auVar29._0_12_ = *pauVar4;
      auVar165 = vsubps_avx(auVar29,auVar115);
      uVar111 = auVar165._0_4_;
      auVar197._4_4_ = uVar111;
      auVar197._0_4_ = uVar111;
      auVar197._8_4_ = uVar111;
      auVar197._12_4_ = uVar111;
      auVar115 = vshufps_avx(auVar165,auVar165,0x55);
      auVar165 = vshufps_avx(auVar165,auVar165,0xaa);
      auVar227._0_4_ = fVar217 * auVar165._0_4_;
      auVar227._4_4_ = fVar220 * auVar165._4_4_;
      auVar227._8_4_ = fVar221 * auVar165._8_4_;
      auVar227._12_4_ = fVar222 * auVar165._12_4_;
      auVar115 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar10,auVar115);
      auVar197 = vfmadd231ps_fma(auVar115,(undefined1  [16])aVar9,auVar197);
      auVar115 = vblendps_avx(auVar197,auVar29,8);
      auVar30._4_4_ = uStack_42c;
      auVar30._0_4_ = local_430;
      auVar30._8_4_ = uStack_428;
      auVar30._12_4_ = uStack_424;
      auVar113 = vandps_avx(auVar113,auVar30);
      auVar195 = vandps_avx(auVar195,auVar30);
      auVar165 = vmaxps_avx(auVar113,auVar195);
      auVar113 = vandps_avx(auVar23,auVar30);
      auVar195 = vandps_avx(auVar115,auVar30);
      auVar113 = vmaxps_avx(auVar113,auVar195);
      auVar113 = vmaxps_avx(auVar165,auVar113);
      auVar195 = vmovshdup_avx(auVar113);
      auVar195 = vmaxss_avx(auVar195,auVar113);
      auVar113 = vshufpd_avx(auVar113,auVar113,1);
      auVar113 = vmaxss_avx(auVar113,auVar195);
      lVar28 = (long)iVar105 * 0x44;
      auVar195 = vmovshdup_avx(auVar184);
      uVar112 = auVar195._0_8_;
      local_560._8_8_ = uVar112;
      local_560._0_8_ = uVar112;
      local_560._16_8_ = uVar112;
      local_560._24_8_ = uVar112;
      auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar28 + 0x484);
      auVar195 = vmovshdup_avx(auVar185);
      uVar112 = auVar195._0_8_;
      local_580._8_8_ = uVar112;
      local_580._0_8_ = uVar112;
      local_580._16_8_ = uVar112;
      local_580._24_8_ = uVar112;
      auVar127 = *(undefined1 (*) [32])(bspline_basis0 + lVar28 + 0x908);
      uVar216 = auVar196._0_4_;
      local_7a0._4_4_ = uVar216;
      local_7a0._0_4_ = uVar216;
      local_7a0._8_4_ = uVar216;
      local_7a0._12_4_ = uVar216;
      local_7a0._16_4_ = uVar216;
      local_7a0._20_4_ = uVar216;
      local_7a0._24_4_ = uVar216;
      local_7a0._28_4_ = uVar216;
      auVar195 = vmovshdup_avx(auVar196);
      uVar112 = auVar195._0_8_;
      local_6c0._8_8_ = uVar112;
      local_6c0._0_8_ = uVar112;
      local_6c0._16_8_ = uVar112;
      local_6c0._24_8_ = uVar112;
      pauVar5 = (undefined1 (*) [32])(bspline_basis0 + lVar28 + 0xd8c);
      fVar220 = *(float *)*pauVar5;
      fVar221 = *(float *)(bspline_basis0 + lVar28 + 0xd90);
      fVar222 = *(float *)(bspline_basis0 + lVar28 + 0xd94);
      fVar223 = *(float *)(bspline_basis0 + lVar28 + 0xd98);
      fVar224 = *(float *)(bspline_basis0 + lVar28 + 0xd9c);
      fVar225 = *(float *)(bspline_basis0 + lVar28 + 0xda0);
      fVar183 = *(float *)(bspline_basis0 + lVar28 + 0xda4);
      auVar102 = *(undefined1 (*) [28])*pauVar5;
      local_540 = auVar197._0_4_;
      auVar195 = vmovshdup_avx(auVar197);
      uVar112 = auVar195._0_8_;
      auVar186._0_4_ = fVar220 * local_540;
      auVar186._4_4_ = fVar221 * local_540;
      auVar186._8_4_ = fVar222 * local_540;
      auVar186._12_4_ = fVar223 * local_540;
      auVar186._16_4_ = fVar224 * local_540;
      auVar186._20_4_ = fVar225 * local_540;
      auVar186._24_4_ = fVar183 * local_540;
      auVar186._28_4_ = 0;
      local_760 = auVar195._0_4_;
      auVar116._0_4_ = local_760 * fVar220;
      fStack_75c = auVar195._4_4_;
      auVar116._4_4_ = fStack_75c * fVar221;
      auVar116._8_4_ = local_760 * fVar222;
      auVar116._12_4_ = fStack_75c * fVar223;
      auVar116._16_4_ = local_760 * fVar224;
      auVar116._20_4_ = fStack_75c * fVar225;
      auVar116._24_4_ = local_760 * fVar183;
      auVar116._28_4_ = 0;
      auVar195 = vfmadd231ps_fma(auVar186,auVar127,local_7a0);
      auVar23 = vfmadd231ps_fma(auVar116,auVar127,local_6c0);
      uVar192 = auVar185._0_4_;
      auVar245._4_4_ = uVar192;
      auVar245._0_4_ = uVar192;
      auVar245._8_4_ = uVar192;
      auVar245._12_4_ = uVar192;
      auVar245._16_4_ = uVar192;
      auVar245._20_4_ = uVar192;
      auVar245._24_4_ = uVar192;
      auVar245._28_4_ = uVar192;
      auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar125,auVar245);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar125,local_580);
      auVar182 = *(undefined1 (*) [32])(bspline_basis0 + lVar28);
      uVar111 = auVar184._0_4_;
      auVar240._4_4_ = uVar111;
      auVar240._0_4_ = uVar111;
      auVar240._8_4_ = uVar111;
      auVar240._12_4_ = uVar111;
      auVar240._16_4_ = uVar111;
      auVar240._20_4_ = uVar111;
      auVar240._24_4_ = uVar111;
      auVar240._28_4_ = uVar111;
      auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar182,auVar240);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar182,local_560);
      auVar123 = *(undefined1 (*) [32])(bspline_basis1 + lVar28 + 0x908);
      fVar88 = *(float *)(bspline_basis1 + lVar28 + 0xd8c);
      fVar89 = *(float *)(bspline_basis1 + lVar28 + 0xd90);
      fVar90 = *(float *)(bspline_basis1 + lVar28 + 0xd94);
      fVar91 = *(float *)(bspline_basis1 + lVar28 + 0xd98);
      fVar92 = *(float *)(bspline_basis1 + lVar28 + 0xd9c);
      fVar93 = *(float *)(bspline_basis1 + lVar28 + 0xda0);
      fVar94 = *(float *)(bspline_basis1 + lVar28 + 0xda4);
      auVar31._4_4_ = local_540 * fVar89;
      auVar31._0_4_ = local_540 * fVar88;
      auVar31._8_4_ = local_540 * fVar90;
      auVar31._12_4_ = local_540 * fVar91;
      auVar31._16_4_ = local_540 * fVar92;
      auVar31._20_4_ = local_540 * fVar93;
      auVar31._24_4_ = local_540 * fVar94;
      auVar31._28_4_ = local_540;
      auVar115 = vfmadd231ps_fma(auVar31,auVar123,local_7a0);
      auVar32._4_4_ = fStack_75c * fVar89;
      auVar32._0_4_ = local_760 * fVar88;
      auVar32._8_4_ = local_760 * fVar90;
      auVar32._12_4_ = fStack_75c * fVar91;
      auVar32._16_4_ = local_760 * fVar92;
      auVar32._20_4_ = fStack_75c * fVar93;
      auVar32._24_4_ = local_760 * fVar94;
      auVar32._28_4_ = uVar216;
      auVar165 = vfmadd231ps_fma(auVar32,auVar123,local_6c0);
      auVar136 = *(undefined1 (*) [32])(bspline_basis1 + lVar28 + 0x484);
      auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar136,auVar245);
      auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar136,local_580);
      auVar25 = *(undefined1 (*) [32])(bspline_basis1 + lVar28);
      auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar25,auVar240);
      auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar25,local_560);
      auVar131 = ZEXT1632(auVar115);
      _local_5e0 = ZEXT1632(auVar195);
      auVar27 = vsubps_avx(auVar131,_local_5e0);
      local_460 = ZEXT1632(auVar165);
      auVar117 = ZEXT1632(auVar23);
      local_480 = vsubps_avx(local_460,auVar117);
      auVar118._0_4_ = auVar27._0_4_ * auVar23._0_4_;
      auVar118._4_4_ = auVar27._4_4_ * auVar23._4_4_;
      auVar118._8_4_ = auVar27._8_4_ * auVar23._8_4_;
      auVar118._12_4_ = auVar27._12_4_ * auVar23._12_4_;
      auVar118._16_4_ = auVar27._16_4_ * 0.0;
      auVar118._20_4_ = auVar27._20_4_ * 0.0;
      auVar118._24_4_ = auVar27._24_4_ * 0.0;
      auVar118._28_4_ = 0;
      fVar226 = local_480._0_4_;
      auVar132._0_4_ = fVar226 * auVar195._0_4_;
      fVar232 = local_480._4_4_;
      auVar132._4_4_ = fVar232 * auVar195._4_4_;
      fVar234 = local_480._8_4_;
      auVar132._8_4_ = fVar234 * auVar195._8_4_;
      fVar235 = local_480._12_4_;
      auVar132._12_4_ = fVar235 * auVar195._12_4_;
      fVar236 = local_480._16_4_;
      auVar132._16_4_ = fVar236 * 0.0;
      fVar237 = local_480._20_4_;
      auVar132._20_4_ = fVar237 * 0.0;
      fVar193 = local_480._24_4_;
      auVar132._24_4_ = fVar193 * 0.0;
      auVar132._28_4_ = 0;
      auVar26 = vsubps_avx(auVar118,auVar132);
      auVar195 = vpermilps_avx(*pauVar1,0xff);
      uVar130 = auVar195._0_8_;
      local_a0._8_8_ = uVar130;
      local_a0._0_8_ = uVar130;
      local_a0._16_8_ = uVar130;
      local_a0._24_8_ = uVar130;
      auVar23 = vpermilps_avx(*pauVar2,0xff);
      uVar130 = auVar23._0_8_;
      local_c0._8_8_ = uVar130;
      local_c0._0_8_ = uVar130;
      local_c0._16_8_ = uVar130;
      local_c0._24_8_ = uVar130;
      auVar23 = vpermilps_avx(*pauVar3,0xff);
      uVar130 = auVar23._0_8_;
      local_e0._8_8_ = uVar130;
      local_e0._0_8_ = uVar130;
      local_e0._16_8_ = uVar130;
      local_e0._24_8_ = uVar130;
      auVar23._12_4_ = fStack_8d4;
      auVar23._0_12_ = *pauVar4;
      auVar23 = vpermilps_avx(auVar23,0xff);
      local_100 = auVar23._0_8_;
      fVar217 = auVar23._0_4_;
      auVar187._0_4_ = fVar220 * fVar217;
      fVar220 = auVar23._4_4_;
      auVar187._4_4_ = fVar221 * fVar220;
      auVar187._8_4_ = fVar222 * fVar217;
      auVar187._12_4_ = fVar223 * fVar220;
      auVar187._16_4_ = fVar224 * fVar217;
      auVar187._20_4_ = fVar225 * fVar220;
      auVar187._24_4_ = fVar183 * fVar217;
      auVar187._28_4_ = 0;
      auVar23 = vfmadd231ps_fma(auVar187,local_e0,auVar127);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),local_c0,auVar125);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar182,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar33._4_4_ = fVar220 * fVar89;
      auVar33._0_4_ = fVar217 * fVar88;
      auVar33._8_4_ = fVar217 * fVar90;
      auVar33._12_4_ = fVar220 * fVar91;
      auVar33._16_4_ = fVar217 * fVar92;
      auVar33._20_4_ = fVar220 * fVar93;
      auVar33._24_4_ = fVar217 * fVar94;
      auVar33._28_4_ = auVar182._28_4_;
      auVar115 = vfmadd231ps_fma(auVar33,auVar123,local_e0);
      auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar136,local_c0);
      auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar25,local_a0);
      auVar34._4_4_ = fVar232 * fVar232;
      auVar34._0_4_ = fVar226 * fVar226;
      auVar34._8_4_ = fVar234 * fVar234;
      auVar34._12_4_ = fVar235 * fVar235;
      auVar34._16_4_ = fVar236 * fVar236;
      auVar34._20_4_ = fVar237 * fVar237;
      auVar34._24_4_ = fVar193 * fVar193;
      auVar34._28_4_ = auVar195._4_4_;
      auVar195 = vfmadd231ps_fma(auVar34,auVar27,auVar27);
      auVar158 = vmaxps_avx(ZEXT1632(auVar23),ZEXT1632(auVar115));
      auVar35._4_4_ = auVar158._4_4_ * auVar158._4_4_ * auVar195._4_4_;
      auVar35._0_4_ = auVar158._0_4_ * auVar158._0_4_ * auVar195._0_4_;
      auVar35._8_4_ = auVar158._8_4_ * auVar158._8_4_ * auVar195._8_4_;
      auVar35._12_4_ = auVar158._12_4_ * auVar158._12_4_ * auVar195._12_4_;
      auVar35._16_4_ = auVar158._16_4_ * auVar158._16_4_ * 0.0;
      auVar35._20_4_ = auVar158._20_4_ * auVar158._20_4_ * 0.0;
      auVar35._24_4_ = auVar158._24_4_ * auVar158._24_4_ * 0.0;
      auVar35._28_4_ = auVar158._28_4_;
      auVar36._4_4_ = auVar26._4_4_ * auVar26._4_4_;
      auVar36._0_4_ = auVar26._0_4_ * auVar26._0_4_;
      auVar36._8_4_ = auVar26._8_4_ * auVar26._8_4_;
      auVar36._12_4_ = auVar26._12_4_ * auVar26._12_4_;
      auVar36._16_4_ = auVar26._16_4_ * auVar26._16_4_;
      auVar36._20_4_ = auVar26._20_4_ * auVar26._20_4_;
      auVar36._24_4_ = auVar26._24_4_ * auVar26._24_4_;
      auVar36._28_4_ = auVar26._28_4_;
      auVar158 = vcmpps_avx(auVar36,auVar35,2);
      fVar217 = auVar113._0_4_ * 4.7683716e-07;
      auVar119._0_4_ = (float)iVar105;
      uStack_59c = auVar196._4_4_;
      uStack_598 = auVar196._8_4_;
      uStack_594 = auVar196._12_4_;
      auVar119._4_4_ = auVar119._0_4_;
      auVar119._8_4_ = auVar119._0_4_;
      auVar119._12_4_ = auVar119._0_4_;
      auVar119._16_4_ = auVar119._0_4_;
      auVar119._20_4_ = auVar119._0_4_;
      auVar119._24_4_ = auVar119._0_4_;
      auVar119._28_4_ = auVar119._0_4_;
      auVar26 = vcmpps_avx(_DAT_01faff40,auVar119,1);
      auVar113 = vpermilps_avx(auVar184,0xaa);
      uVar130 = auVar113._0_8_;
      local_6e0._8_8_ = uVar130;
      local_6e0._0_8_ = uVar130;
      local_6e0._16_8_ = uVar130;
      local_6e0._24_8_ = uVar130;
      auVar113 = vpermilps_avx(auVar185,0xaa);
      uVar130 = auVar113._0_8_;
      auVar162._8_8_ = uVar130;
      auVar162._0_8_ = uVar130;
      auVar162._16_8_ = uVar130;
      auVar162._24_8_ = uVar130;
      auVar113 = vshufps_avx(auVar196,auVar196,0xaa);
      uVar130 = auVar113._0_8_;
      local_720._8_8_ = uVar130;
      local_720._0_8_ = uVar130;
      local_720._16_8_ = uVar130;
      local_720._24_8_ = uVar130;
      auVar219 = ZEXT3264(local_720);
      auVar113 = vshufps_avx(auVar197,auVar197,0xaa);
      uVar130 = auVar113._0_8_;
      register0x00001508 = uVar130;
      local_740 = uVar130;
      register0x00001510 = uVar130;
      register0x00001518 = uVar130;
      auVar230 = ZEXT3264(_local_740);
      auVar24 = auVar26 & auVar158;
      uVar8 = *(uint *)(ray + k * 4 + 0x60);
      local_7c0._0_16_ = ZEXT416(uVar8);
      fStack_758 = local_760;
      fStack_754 = fStack_75c;
      fStack_750 = local_760;
      fStack_74c = fStack_75c;
      fStack_748 = local_760;
      fStack_744 = fStack_75c;
      local_5a0 = auVar119._0_4_;
      fStack_53c = local_540;
      fStack_538 = local_540;
      fStack_534 = local_540;
      fStack_530 = local_540;
      fStack_52c = local_540;
      fStack_528 = local_540;
      fStack_524 = local_540;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar24 >> 0x7f,0) == '\0') &&
            (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar24 >> 0xbf,0) == '\0') &&
          (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar24[0x1f])
      {
        auVar199 = ZEXT3264(CONCAT428(fStack_75c,
                                      CONCAT424(local_760,
                                                CONCAT420(fStack_75c,
                                                          CONCAT416(local_760,
                                                                    CONCAT412(fStack_75c,
                                                                              CONCAT48(local_760,
                                                                                       uVar112))))))
                           );
      }
      else {
        _local_4c0 = vandps_avx(auVar158,auVar26);
        fVar226 = auVar113._0_4_;
        fVar232 = auVar113._4_4_;
        auVar37._4_4_ = fVar232 * fVar89;
        auVar37._0_4_ = fVar226 * fVar88;
        auVar37._8_4_ = fVar226 * fVar90;
        auVar37._12_4_ = fVar232 * fVar91;
        auVar37._16_4_ = fVar226 * fVar92;
        auVar37._20_4_ = fVar232 * fVar93;
        auVar37._24_4_ = fVar226 * fVar94;
        auVar37._28_4_ = local_4c0._28_4_;
        auVar113 = vfmadd213ps_fma(auVar123,local_720,auVar37);
        auVar113 = vfmadd213ps_fma(auVar136,auVar162,ZEXT1632(auVar113));
        auVar113 = vfmadd213ps_fma(auVar25,local_6e0,ZEXT1632(auVar113));
        local_4e0 = ZEXT1632(auVar113);
        local_4a0._0_4_ = auVar102._0_4_;
        local_4a0._4_4_ = auVar102._4_4_;
        fStack_498 = auVar102._8_4_;
        fStack_494 = auVar102._12_4_;
        fStack_490 = auVar102._16_4_;
        fStack_48c = auVar102._20_4_;
        fStack_488 = auVar102._24_4_;
        auVar38._4_4_ = fVar232 * (float)local_4a0._4_4_;
        auVar38._0_4_ = fVar226 * (float)local_4a0._0_4_;
        auVar38._8_4_ = fVar226 * fStack_498;
        auVar38._12_4_ = fVar232 * fStack_494;
        auVar38._16_4_ = fVar226 * fStack_490;
        auVar38._20_4_ = fVar232 * fStack_48c;
        auVar38._24_4_ = fVar226 * fStack_488;
        auVar38._28_4_ = local_4c0._28_4_;
        auVar113 = vfmadd213ps_fma(auVar127,local_720,auVar38);
        auVar113 = vfmadd213ps_fma(auVar125,auVar162,ZEXT1632(auVar113));
        auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar28 + 0x1210);
        auVar127 = *(undefined1 (*) [32])(bspline_basis0 + lVar28 + 0x1694);
        auVar123 = *(undefined1 (*) [32])(bspline_basis0 + lVar28 + 0x1b18);
        fVar220 = *(float *)(bspline_basis0 + lVar28 + 0x1f9c);
        fVar221 = *(float *)(bspline_basis0 + lVar28 + 0x1fa0);
        fVar222 = *(float *)(bspline_basis0 + lVar28 + 0x1fa4);
        fVar223 = *(float *)(bspline_basis0 + lVar28 + 0x1fa8);
        fVar224 = *(float *)(bspline_basis0 + lVar28 + 0x1fac);
        fVar225 = *(float *)(bspline_basis0 + lVar28 + 0x1fb0);
        fVar183 = *(float *)(bspline_basis0 + lVar28 + 0x1fb4);
        auVar178._0_4_ = local_540 * fVar220;
        auVar178._4_4_ = local_540 * fVar221;
        auVar178._8_4_ = local_540 * fVar222;
        auVar178._12_4_ = local_540 * fVar223;
        auVar178._16_4_ = local_540 * fVar224;
        auVar178._20_4_ = local_540 * fVar225;
        auVar178._24_4_ = local_540 * fVar183;
        auVar178._28_4_ = 0;
        auVar206._0_4_ = local_760 * fVar220;
        auVar206._4_4_ = fStack_75c * fVar221;
        auVar206._8_4_ = local_760 * fVar222;
        auVar206._12_4_ = fStack_75c * fVar223;
        auVar206._16_4_ = local_760 * fVar224;
        auVar206._20_4_ = fStack_75c * fVar225;
        auVar206._24_4_ = local_760 * fVar183;
        auVar206._28_4_ = 0;
        auVar213._0_4_ = fVar220 * fVar226;
        auVar213._4_4_ = fVar221 * fVar232;
        auVar213._8_4_ = fVar222 * fVar226;
        auVar213._12_4_ = fVar223 * fVar232;
        auVar213._16_4_ = fVar224 * fVar226;
        auVar213._20_4_ = fVar225 * fVar232;
        auVar213._24_4_ = fVar183 * fVar226;
        auVar213._28_4_ = 0;
        auVar195 = vfmadd231ps_fma(auVar178,auVar123,local_7a0);
        auVar165 = vfmadd231ps_fma(auVar206,auVar123,local_6c0);
        auVar184 = vfmadd231ps_fma(auVar213,local_720,auVar123);
        auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar127,auVar245);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar127,local_580);
        auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),auVar162,auVar127);
        auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar125,auVar240);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar125,local_560);
        auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),auVar125,local_6e0);
        fVar220 = *(float *)(bspline_basis1 + lVar28 + 0x1f9c);
        fVar221 = *(float *)(bspline_basis1 + lVar28 + 0x1fa0);
        fVar222 = *(float *)(bspline_basis1 + lVar28 + 0x1fa4);
        fVar223 = *(float *)(bspline_basis1 + lVar28 + 0x1fa8);
        fVar224 = *(float *)(bspline_basis1 + lVar28 + 0x1fac);
        fVar225 = *(float *)(bspline_basis1 + lVar28 + 0x1fb0);
        fVar183 = *(float *)(bspline_basis1 + lVar28 + 0x1fb4);
        auVar127._4_4_ = local_540 * fVar221;
        auVar127._0_4_ = local_540 * fVar220;
        auVar127._8_4_ = local_540 * fVar222;
        auVar127._12_4_ = local_540 * fVar223;
        auVar127._16_4_ = local_540 * fVar224;
        auVar127._20_4_ = local_540 * fVar225;
        auVar127._24_4_ = local_540 * fVar183;
        auVar127._28_4_ = local_540;
        auVar39._4_4_ = fStack_75c * fVar221;
        auVar39._0_4_ = local_760 * fVar220;
        auVar39._8_4_ = local_760 * fVar222;
        auVar39._12_4_ = fStack_75c * fVar223;
        auVar39._16_4_ = local_760 * fVar224;
        auVar39._20_4_ = fStack_75c * fVar225;
        auVar39._24_4_ = local_760 * fVar183;
        auVar39._28_4_ = fStack_75c;
        auVar40._4_4_ = fVar232 * fVar221;
        auVar40._0_4_ = fVar226 * fVar220;
        auVar40._8_4_ = fVar226 * fVar222;
        auVar40._12_4_ = fVar232 * fVar223;
        auVar40._16_4_ = fVar226 * fVar224;
        auVar40._20_4_ = fVar232 * fVar225;
        auVar40._24_4_ = fVar226 * fVar183;
        auVar40._28_4_ = fVar232;
        auVar125 = *(undefined1 (*) [32])(bspline_basis1 + lVar28 + 0x1b18);
        auVar185 = vfmadd231ps_fma(auVar127,auVar125,local_7a0);
        auVar196 = vfmadd231ps_fma(auVar39,auVar125,local_6c0);
        auVar197 = vfmadd231ps_fma(auVar40,local_720,auVar125);
        auVar125 = *(undefined1 (*) [32])(bspline_basis1 + lVar28 + 0x1694);
        auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar125,auVar245);
        auVar196 = vfmadd231ps_fma(ZEXT1632(auVar196),auVar125,local_580);
        auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar125,auVar162);
        auVar125 = *(undefined1 (*) [32])(bspline_basis1 + lVar28 + 0x1210);
        auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar125,auVar240);
        auVar196 = vfmadd231ps_fma(ZEXT1632(auVar196),auVar125,local_560);
        auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),local_6e0,auVar125);
        auVar125 = vandps_avx(local_2c0,ZEXT1632(auVar195));
        auVar127 = vandps_avx(ZEXT1632(auVar165),local_2c0);
        auVar127 = vmaxps_avx(auVar125,auVar127);
        auVar125 = vandps_avx(ZEXT1632(auVar184),local_2c0);
        auVar125 = vmaxps_avx(auVar127,auVar125);
        auVar133._4_4_ = fVar217;
        auVar133._0_4_ = fVar217;
        auVar133._8_4_ = fVar217;
        auVar133._12_4_ = fVar217;
        auVar133._16_4_ = fVar217;
        auVar133._20_4_ = fVar217;
        auVar133._24_4_ = fVar217;
        auVar133._28_4_ = fVar217;
        auVar125 = vcmpps_avx(auVar125,auVar133,1);
        auVar123 = vblendvps_avx(ZEXT1632(auVar195),auVar27,auVar125);
        auVar136 = vblendvps_avx(ZEXT1632(auVar165),local_480,auVar125);
        auVar125 = vandps_avx(ZEXT1632(auVar185),local_2c0);
        auVar127 = vandps_avx(ZEXT1632(auVar196),local_2c0);
        auVar127 = vmaxps_avx(auVar125,auVar127);
        auVar125 = vandps_avx(ZEXT1632(auVar197),local_2c0);
        auVar125 = vmaxps_avx(auVar127,auVar125);
        auVar127 = vcmpps_avx(auVar125,auVar133,1);
        auVar125 = vblendvps_avx(ZEXT1632(auVar185),auVar27,auVar127);
        auVar127 = vblendvps_avx(ZEXT1632(auVar196),local_480,auVar127);
        auVar113 = vfmadd213ps_fma(auVar182,local_6e0,ZEXT1632(auVar113));
        auVar195 = vfmadd213ps_fma(auVar123,auVar123,ZEXT832(0) << 0x20);
        auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar136,auVar136);
        auVar182 = vrsqrtps_avx(ZEXT1632(auVar195));
        fVar220 = auVar182._0_4_;
        fVar221 = auVar182._4_4_;
        fVar222 = auVar182._8_4_;
        fVar223 = auVar182._12_4_;
        fVar224 = auVar182._16_4_;
        fVar225 = auVar182._20_4_;
        fVar183 = auVar182._24_4_;
        auVar41._4_4_ = fVar221 * fVar221 * fVar221 * auVar195._4_4_ * -0.5;
        auVar41._0_4_ = fVar220 * fVar220 * fVar220 * auVar195._0_4_ * -0.5;
        auVar41._8_4_ = fVar222 * fVar222 * fVar222 * auVar195._8_4_ * -0.5;
        auVar41._12_4_ = fVar223 * fVar223 * fVar223 * auVar195._12_4_ * -0.5;
        auVar41._16_4_ = fVar224 * fVar224 * fVar224 * -0.0;
        auVar41._20_4_ = fVar225 * fVar225 * fVar225 * -0.0;
        auVar41._24_4_ = fVar183 * fVar183 * fVar183 * -0.0;
        auVar41._28_4_ = 0;
        auVar241._8_4_ = 0x3fc00000;
        auVar241._0_8_ = 0x3fc000003fc00000;
        auVar241._12_4_ = 0x3fc00000;
        auVar241._16_4_ = 0x3fc00000;
        auVar241._20_4_ = 0x3fc00000;
        auVar241._24_4_ = 0x3fc00000;
        auVar241._28_4_ = 0x3fc00000;
        auVar195 = vfmadd231ps_fma(auVar41,auVar241,auVar182);
        fVar220 = auVar195._0_4_;
        fVar221 = auVar195._4_4_;
        auVar42._4_4_ = auVar136._4_4_ * fVar221;
        auVar42._0_4_ = auVar136._0_4_ * fVar220;
        fVar222 = auVar195._8_4_;
        auVar42._8_4_ = auVar136._8_4_ * fVar222;
        fVar223 = auVar195._12_4_;
        auVar42._12_4_ = auVar136._12_4_ * fVar223;
        auVar42._16_4_ = auVar136._16_4_ * 0.0;
        auVar42._20_4_ = auVar136._20_4_ * 0.0;
        auVar42._24_4_ = auVar136._24_4_ * 0.0;
        auVar42._28_4_ = auVar182._28_4_;
        auVar43._4_4_ = -auVar123._4_4_ * fVar221;
        auVar43._0_4_ = -auVar123._0_4_ * fVar220;
        auVar43._8_4_ = -auVar123._8_4_ * fVar222;
        auVar43._12_4_ = -auVar123._12_4_ * fVar223;
        auVar43._16_4_ = -auVar123._16_4_ * 0.0;
        auVar43._20_4_ = -auVar123._20_4_ * 0.0;
        auVar43._24_4_ = -auVar123._24_4_ * 0.0;
        auVar43._28_4_ = auVar123._28_4_ ^ 0x80000000;
        auVar195 = vfmadd213ps_fma(auVar125,auVar125,ZEXT832(0) << 0x20);
        auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar127,auVar127);
        auVar182 = vrsqrtps_avx(ZEXT1632(auVar195));
        auVar123 = ZEXT1632(CONCAT412(fVar223 * 0.0,
                                      CONCAT48(fVar222 * 0.0,CONCAT44(fVar221 * 0.0,fVar220 * 0.0)))
                           );
        fVar220 = auVar182._0_4_;
        fVar221 = auVar182._4_4_;
        fVar222 = auVar182._8_4_;
        fVar223 = auVar182._12_4_;
        fVar224 = auVar182._16_4_;
        fVar225 = auVar182._20_4_;
        fVar183 = auVar182._24_4_;
        auVar44._4_4_ = fVar221 * fVar221 * auVar195._4_4_ * -0.5 * fVar221;
        auVar44._0_4_ = fVar220 * fVar220 * auVar195._0_4_ * -0.5 * fVar220;
        auVar44._8_4_ = fVar222 * fVar222 * auVar195._8_4_ * -0.5 * fVar222;
        auVar44._12_4_ = fVar223 * fVar223 * auVar195._12_4_ * -0.5 * fVar223;
        auVar44._16_4_ = fVar224 * fVar224 * fVar224 * -0.0;
        auVar44._20_4_ = fVar225 * fVar225 * fVar225 * -0.0;
        auVar44._24_4_ = fVar183 * fVar183 * fVar183 * -0.0;
        auVar44._28_4_ = 0xbf000000;
        auVar195 = vfmadd231ps_fma(auVar44,auVar241,auVar182);
        fVar220 = auVar195._0_4_;
        fVar221 = auVar195._4_4_;
        auVar45._4_4_ = fVar221 * auVar127._4_4_;
        auVar45._0_4_ = fVar220 * auVar127._0_4_;
        fVar222 = auVar195._8_4_;
        auVar45._8_4_ = fVar222 * auVar127._8_4_;
        fVar223 = auVar195._12_4_;
        auVar45._12_4_ = fVar223 * auVar127._12_4_;
        auVar45._16_4_ = auVar127._16_4_ * 0.0;
        auVar45._20_4_ = auVar127._20_4_ * 0.0;
        auVar45._24_4_ = auVar127._24_4_ * 0.0;
        auVar45._28_4_ = auVar27._28_4_;
        auVar46._4_4_ = fVar221 * -auVar125._4_4_;
        auVar46._0_4_ = fVar220 * -auVar125._0_4_;
        auVar46._8_4_ = fVar222 * -auVar125._8_4_;
        auVar46._12_4_ = fVar223 * -auVar125._12_4_;
        auVar46._16_4_ = -auVar125._16_4_ * 0.0;
        auVar46._20_4_ = -auVar125._20_4_ * 0.0;
        auVar46._24_4_ = -auVar125._24_4_ * 0.0;
        auVar46._28_4_ = 0;
        auVar47._28_4_ = auVar182._28_4_;
        auVar47._0_28_ =
             ZEXT1628(CONCAT412(fVar223 * 0.0,
                                CONCAT48(fVar222 * 0.0,CONCAT44(fVar221 * 0.0,fVar220 * 0.0))));
        auVar195 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar23),_local_5e0);
        auVar125 = ZEXT1632(auVar23);
        auVar165 = vfmadd213ps_fma(auVar43,auVar125,auVar117);
        auVar184 = vfmadd213ps_fma(auVar123,auVar125,ZEXT1632(auVar113));
        auVar197 = vfnmadd213ps_fma(auVar42,auVar125,_local_5e0);
        auVar185 = vfmadd213ps_fma(auVar45,ZEXT1632(auVar115),auVar131);
        auVar29 = vfnmadd213ps_fma(auVar43,auVar125,auVar117);
        auVar125 = ZEXT1632(auVar115);
        auVar196 = vfmadd213ps_fma(auVar46,auVar125,local_460);
        auVar188 = ZEXT1632(auVar23);
        auVar218 = vfnmadd231ps_fma(ZEXT1632(auVar113),auVar188,auVar123);
        auVar23 = vfmadd213ps_fma(auVar47,auVar125,local_4e0);
        auVar30 = vfnmadd213ps_fma(auVar45,auVar125,auVar131);
        auVar212 = vfnmadd213ps_fma(auVar46,auVar125,local_460);
        local_5c0 = ZEXT1632(auVar115);
        auVar227 = vfnmadd231ps_fma(local_4e0,local_5c0,auVar47);
        auVar125 = vsubps_avx(ZEXT1632(auVar196),ZEXT1632(auVar29));
        auVar127 = vsubps_avx(ZEXT1632(auVar23),ZEXT1632(auVar218));
        auVar156._0_4_ = auVar218._0_4_ * auVar125._0_4_;
        auVar156._4_4_ = auVar218._4_4_ * auVar125._4_4_;
        auVar156._8_4_ = auVar218._8_4_ * auVar125._8_4_;
        auVar156._12_4_ = auVar218._12_4_ * auVar125._12_4_;
        auVar156._16_4_ = auVar125._16_4_ * 0.0;
        auVar156._20_4_ = auVar125._20_4_ * 0.0;
        auVar156._24_4_ = auVar125._24_4_ * 0.0;
        auVar156._28_4_ = 0;
        auVar115 = vfmsub231ps_fma(auVar156,ZEXT1632(auVar29),auVar127);
        auVar48._4_4_ = auVar127._4_4_ * auVar197._4_4_;
        auVar48._0_4_ = auVar127._0_4_ * auVar197._0_4_;
        auVar48._8_4_ = auVar127._8_4_ * auVar197._8_4_;
        auVar48._12_4_ = auVar127._12_4_ * auVar197._12_4_;
        auVar48._16_4_ = auVar127._16_4_ * 0.0;
        auVar48._20_4_ = auVar127._20_4_ * 0.0;
        auVar48._24_4_ = auVar127._24_4_ * 0.0;
        auVar48._28_4_ = auVar127._28_4_;
        auVar127 = vsubps_avx(ZEXT1632(auVar185),ZEXT1632(auVar197));
        auVar113 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar218),auVar127);
        auVar49._4_4_ = auVar29._4_4_ * auVar127._4_4_;
        auVar49._0_4_ = auVar29._0_4_ * auVar127._0_4_;
        auVar49._8_4_ = auVar29._8_4_ * auVar127._8_4_;
        auVar49._12_4_ = auVar29._12_4_ * auVar127._12_4_;
        auVar49._16_4_ = auVar127._16_4_ * 0.0;
        auVar49._20_4_ = auVar127._20_4_ * 0.0;
        auVar49._24_4_ = auVar127._24_4_ * 0.0;
        auVar49._28_4_ = auVar127._28_4_;
        auVar158 = ZEXT1632(auVar197);
        auVar197 = vfmsub231ps_fma(auVar49,auVar158,auVar125);
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar197),ZEXT832(0) << 0x20,ZEXT1632(auVar113));
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),ZEXT832(0) << 0x20,ZEXT1632(auVar115));
        auVar24 = vcmpps_avx(ZEXT1632(auVar113),ZEXT832(0) << 0x20,2);
        auVar125 = vblendvps_avx(ZEXT1632(auVar30),ZEXT1632(auVar195),auVar24);
        auVar127 = vblendvps_avx(ZEXT1632(auVar212),ZEXT1632(auVar165),auVar24);
        auVar182 = vblendvps_avx(ZEXT1632(auVar227),ZEXT1632(auVar184),auVar24);
        auVar123 = vblendvps_avx(auVar158,ZEXT1632(auVar185),auVar24);
        auVar136 = vblendvps_avx(ZEXT1632(auVar29),ZEXT1632(auVar196),auVar24);
        auVar25 = vblendvps_avx(ZEXT1632(auVar218),ZEXT1632(auVar23),auVar24);
        auVar158 = vblendvps_avx(ZEXT1632(auVar185),auVar158,auVar24);
        auVar26 = vblendvps_avx(ZEXT1632(auVar196),ZEXT1632(auVar29),auVar24);
        auVar113 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
        auVar27 = vblendvps_avx(ZEXT1632(auVar23),ZEXT1632(auVar218),auVar24);
        auVar117 = vsubps_avx(auVar158,auVar125);
        auVar131 = vsubps_avx(auVar26,auVar127);
        auVar155 = vsubps_avx(auVar27,auVar182);
        auVar126 = vsubps_avx(auVar125,auVar123);
        auVar177 = vsubps_avx(auVar127,auVar136);
        auVar198 = vsubps_avx(auVar182,auVar25);
        auVar50._4_4_ = auVar155._4_4_ * auVar125._4_4_;
        auVar50._0_4_ = auVar155._0_4_ * auVar125._0_4_;
        auVar50._8_4_ = auVar155._8_4_ * auVar125._8_4_;
        auVar50._12_4_ = auVar155._12_4_ * auVar125._12_4_;
        auVar50._16_4_ = auVar155._16_4_ * auVar125._16_4_;
        auVar50._20_4_ = auVar155._20_4_ * auVar125._20_4_;
        auVar50._24_4_ = auVar155._24_4_ * auVar125._24_4_;
        auVar50._28_4_ = auVar27._28_4_;
        auVar195 = vfmsub231ps_fma(auVar50,auVar182,auVar117);
        auVar51._4_4_ = auVar127._4_4_ * auVar117._4_4_;
        auVar51._0_4_ = auVar127._0_4_ * auVar117._0_4_;
        auVar51._8_4_ = auVar127._8_4_ * auVar117._8_4_;
        auVar51._12_4_ = auVar127._12_4_ * auVar117._12_4_;
        auVar51._16_4_ = auVar127._16_4_ * auVar117._16_4_;
        auVar51._20_4_ = auVar127._20_4_ * auVar117._20_4_;
        auVar51._24_4_ = auVar127._24_4_ * auVar117._24_4_;
        auVar51._28_4_ = auVar158._28_4_;
        auVar23 = vfmsub231ps_fma(auVar51,auVar125,auVar131);
        auVar195 = vfmadd231ps_fma(ZEXT1632(auVar23),ZEXT832(0) << 0x20,ZEXT1632(auVar195));
        auVar120._0_4_ = auVar131._0_4_ * auVar182._0_4_;
        auVar120._4_4_ = auVar131._4_4_ * auVar182._4_4_;
        auVar120._8_4_ = auVar131._8_4_ * auVar182._8_4_;
        auVar120._12_4_ = auVar131._12_4_ * auVar182._12_4_;
        auVar120._16_4_ = auVar131._16_4_ * auVar182._16_4_;
        auVar120._20_4_ = auVar131._20_4_ * auVar182._20_4_;
        auVar120._24_4_ = auVar131._24_4_ * auVar182._24_4_;
        auVar120._28_4_ = 0;
        auVar23 = vfmsub231ps_fma(auVar120,auVar127,auVar155);
        auVar23 = vfmadd231ps_fma(ZEXT1632(auVar195),ZEXT832(0) << 0x20,ZEXT1632(auVar23));
        auVar121._0_4_ = auVar198._0_4_ * auVar123._0_4_;
        auVar121._4_4_ = auVar198._4_4_ * auVar123._4_4_;
        auVar121._8_4_ = auVar198._8_4_ * auVar123._8_4_;
        auVar121._12_4_ = auVar198._12_4_ * auVar123._12_4_;
        auVar121._16_4_ = auVar198._16_4_ * auVar123._16_4_;
        auVar121._20_4_ = auVar198._20_4_ * auVar123._20_4_;
        auVar121._24_4_ = auVar198._24_4_ * auVar123._24_4_;
        auVar121._28_4_ = 0;
        auVar195 = vfmsub231ps_fma(auVar121,auVar126,auVar25);
        auVar52._4_4_ = auVar177._4_4_ * auVar25._4_4_;
        auVar52._0_4_ = auVar177._0_4_ * auVar25._0_4_;
        auVar52._8_4_ = auVar177._8_4_ * auVar25._8_4_;
        auVar52._12_4_ = auVar177._12_4_ * auVar25._12_4_;
        auVar52._16_4_ = auVar177._16_4_ * auVar25._16_4_;
        auVar52._20_4_ = auVar177._20_4_ * auVar25._20_4_;
        auVar52._24_4_ = auVar177._24_4_ * auVar25._24_4_;
        auVar52._28_4_ = auVar25._28_4_;
        auVar115 = vfmsub231ps_fma(auVar52,auVar136,auVar198);
        auVar53._4_4_ = auVar126._4_4_ * auVar136._4_4_;
        auVar53._0_4_ = auVar126._0_4_ * auVar136._0_4_;
        auVar53._8_4_ = auVar126._8_4_ * auVar136._8_4_;
        auVar53._12_4_ = auVar126._12_4_ * auVar136._12_4_;
        auVar53._16_4_ = auVar126._16_4_ * auVar136._16_4_;
        auVar53._20_4_ = auVar126._20_4_ * auVar136._20_4_;
        auVar53._24_4_ = auVar126._24_4_ * auVar136._24_4_;
        auVar53._28_4_ = auVar26._28_4_;
        auVar165 = vfmsub231ps_fma(auVar53,auVar177,auVar123);
        auVar195 = vfmadd231ps_fma(ZEXT1632(auVar165),ZEXT832(0) << 0x20,ZEXT1632(auVar195));
        auVar115 = vfmadd231ps_fma(ZEXT1632(auVar195),ZEXT832(0) << 0x20,ZEXT1632(auVar115));
        auVar123 = vmaxps_avx(ZEXT1632(auVar23),ZEXT1632(auVar115));
        auVar123 = vcmpps_avx(auVar123,ZEXT832(0) << 0x20,2);
        auVar195 = vpackssdw_avx(auVar123._0_16_,auVar123._16_16_);
        auVar113 = vpand_avx(auVar195,auVar113);
        auVar123 = vpmovsxwd_avx2(auVar113);
        if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar123 >> 0x7f,0) == '\0') &&
              (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar123 >> 0xbf,0) == '\0') &&
            (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar123[0x1f]) {
LAB_0183dd3d:
          auVar176._8_8_ = uStack_638;
          auVar176._0_8_ = local_640;
          auVar176._16_8_ = uStack_630;
          auVar176._24_8_ = uStack_628;
          auVar209._8_4_ = local_760;
          auVar209._0_8_ = uVar112;
          auVar209._12_4_ = fStack_75c;
          auVar209._16_4_ = local_760;
          auVar209._20_4_ = fStack_75c;
          auVar209._24_4_ = local_760;
          auVar209._28_4_ = fStack_75c;
        }
        else {
          auVar54._4_4_ = auVar131._4_4_ * auVar198._4_4_;
          auVar54._0_4_ = auVar131._0_4_ * auVar198._0_4_;
          auVar54._8_4_ = auVar131._8_4_ * auVar198._8_4_;
          auVar54._12_4_ = auVar131._12_4_ * auVar198._12_4_;
          auVar54._16_4_ = auVar131._16_4_ * auVar198._16_4_;
          auVar54._20_4_ = auVar131._20_4_ * auVar198._20_4_;
          auVar54._24_4_ = auVar131._24_4_ * auVar198._24_4_;
          auVar54._28_4_ = auVar123._28_4_;
          auVar185 = vfmsub231ps_fma(auVar54,auVar177,auVar155);
          auVar134._0_4_ = auVar155._0_4_ * auVar126._0_4_;
          auVar134._4_4_ = auVar155._4_4_ * auVar126._4_4_;
          auVar134._8_4_ = auVar155._8_4_ * auVar126._8_4_;
          auVar134._12_4_ = auVar155._12_4_ * auVar126._12_4_;
          auVar134._16_4_ = auVar155._16_4_ * auVar126._16_4_;
          auVar134._20_4_ = auVar155._20_4_ * auVar126._20_4_;
          auVar134._24_4_ = auVar155._24_4_ * auVar126._24_4_;
          auVar134._28_4_ = 0;
          auVar184 = vfmsub231ps_fma(auVar134,auVar117,auVar198);
          auVar55._4_4_ = auVar177._4_4_ * auVar117._4_4_;
          auVar55._0_4_ = auVar177._0_4_ * auVar117._0_4_;
          auVar55._8_4_ = auVar177._8_4_ * auVar117._8_4_;
          auVar55._12_4_ = auVar177._12_4_ * auVar117._12_4_;
          auVar55._16_4_ = auVar177._16_4_ * auVar117._16_4_;
          auVar55._20_4_ = auVar177._20_4_ * auVar117._20_4_;
          auVar55._24_4_ = auVar177._24_4_ * auVar117._24_4_;
          auVar55._28_4_ = auVar136._28_4_;
          auVar196 = vfmsub231ps_fma(auVar55,auVar126,auVar131);
          auVar195 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar184),ZEXT1632(auVar196));
          auVar165 = vfmadd231ps_fma(ZEXT1632(auVar195),ZEXT1632(auVar185),ZEXT832(0) << 0x20);
          auVar123 = vrcpps_avx(ZEXT1632(auVar165));
          auVar214._8_4_ = 0x3f800000;
          auVar214._0_8_ = 0x3f8000003f800000;
          auVar214._12_4_ = 0x3f800000;
          auVar214._16_4_ = 0x3f800000;
          auVar214._20_4_ = 0x3f800000;
          auVar214._24_4_ = 0x3f800000;
          auVar214._28_4_ = 0x3f800000;
          auVar195 = vfnmadd213ps_fma(auVar123,ZEXT1632(auVar165),auVar214);
          auVar195 = vfmadd132ps_fma(ZEXT1632(auVar195),auVar123,auVar123);
          auVar189._0_4_ = auVar196._0_4_ * auVar182._0_4_;
          auVar189._4_4_ = auVar196._4_4_ * auVar182._4_4_;
          auVar189._8_4_ = auVar196._8_4_ * auVar182._8_4_;
          auVar189._12_4_ = auVar196._12_4_ * auVar182._12_4_;
          auVar189._16_4_ = auVar182._16_4_ * 0.0;
          auVar189._20_4_ = auVar182._20_4_ * 0.0;
          auVar189._24_4_ = auVar182._24_4_ * 0.0;
          auVar189._28_4_ = 0;
          auVar184 = vfmadd231ps_fma(auVar189,auVar127,ZEXT1632(auVar184));
          auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),ZEXT1632(auVar185),auVar125);
          fVar220 = auVar195._0_4_;
          fVar221 = auVar195._4_4_;
          fVar222 = auVar195._8_4_;
          fVar223 = auVar195._12_4_;
          auVar182 = ZEXT1632(CONCAT412(fVar223 * auVar184._12_4_,
                                        CONCAT48(fVar222 * auVar184._8_4_,
                                                 CONCAT44(fVar221 * auVar184._4_4_,
                                                          fVar220 * auVar184._0_4_))));
          auVar122._4_4_ = uVar8;
          auVar122._0_4_ = uVar8;
          auVar122._8_4_ = uVar8;
          auVar122._12_4_ = uVar8;
          auVar122._16_4_ = uVar8;
          auVar122._20_4_ = uVar8;
          auVar122._24_4_ = uVar8;
          auVar122._28_4_ = uVar8;
          uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar135._4_4_ = uVar111;
          auVar135._0_4_ = uVar111;
          auVar135._8_4_ = uVar111;
          auVar135._12_4_ = uVar111;
          auVar135._16_4_ = uVar111;
          auVar135._20_4_ = uVar111;
          auVar135._24_4_ = uVar111;
          auVar135._28_4_ = uVar111;
          auVar125 = vcmpps_avx(auVar122,auVar182,2);
          auVar127 = vcmpps_avx(auVar182,auVar135,2);
          auVar125 = vandps_avx(auVar127,auVar125);
          auVar195 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
          auVar113 = vpand_avx(auVar113,auVar195);
          auVar125 = vpmovsxwd_avx2(auVar113);
          if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar125 >> 0x7f,0) == '\0') &&
                (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar125 >> 0xbf,0) == '\0') &&
              (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar125[0x1f]) goto LAB_0183dd3d;
          auVar125 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar165),4);
          auVar195 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
          auVar113 = vpand_avx(auVar113,auVar195);
          auVar125 = vpmovsxwd_avx2(auVar113);
          auVar176._8_8_ = uStack_638;
          auVar176._0_8_ = local_640;
          auVar176._16_8_ = uStack_630;
          auVar176._24_8_ = uStack_628;
          auVar209._8_4_ = local_760;
          auVar209._0_8_ = uVar112;
          auVar209._12_4_ = fStack_75c;
          auVar209._16_4_ = local_760;
          auVar209._20_4_ = fStack_75c;
          auVar209._24_4_ = local_760;
          auVar209._28_4_ = fStack_75c;
          if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar125 >> 0x7f,0) != '\0') ||
                (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar125 >> 0xbf,0) != '\0') ||
              (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar125[0x1f] < '\0') {
            auVar123 = ZEXT1632(CONCAT412(fVar223 * auVar23._12_4_,
                                          CONCAT48(fVar222 * auVar23._8_4_,
                                                   CONCAT44(fVar221 * auVar23._4_4_,
                                                            fVar220 * auVar23._0_4_))));
            auVar136 = ZEXT1632(CONCAT412(fVar223 * auVar115._12_4_,
                                          CONCAT48(fVar222 * auVar115._8_4_,
                                                   CONCAT44(fVar221 * auVar115._4_4_,
                                                            fVar220 * auVar115._0_4_))));
            auVar175._8_4_ = 0x3f800000;
            auVar175._0_8_ = 0x3f8000003f800000;
            auVar175._12_4_ = 0x3f800000;
            auVar175._16_4_ = 0x3f800000;
            auVar175._20_4_ = 0x3f800000;
            auVar175._24_4_ = 0x3f800000;
            auVar175._28_4_ = 0x3f800000;
            auVar127 = vsubps_avx(auVar175,auVar123);
            _local_2a0 = vblendvps_avx(auVar127,auVar123,auVar24);
            auVar127 = vsubps_avx(auVar175,auVar136);
            local_500 = vblendvps_avx(auVar127,auVar136,auVar24);
            auVar176 = auVar125;
            local_600 = auVar182;
          }
        }
        auVar230 = ZEXT3264(_local_740);
        auVar215 = ZEXT3264(auVar162);
        if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar176 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar176 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar176 >> 0x7f,0) != '\0') ||
              (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar176 >> 0xbf,0) != '\0') ||
            (auVar176 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar176[0x1f] < '\0') {
          auVar125 = vsubps_avx(local_5c0,auVar188);
          auVar113 = vfmadd213ps_fma(auVar125,_local_2a0,auVar188);
          fVar220 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar56._4_4_ = (auVar113._4_4_ + auVar113._4_4_) * fVar220;
          auVar56._0_4_ = (auVar113._0_4_ + auVar113._0_4_) * fVar220;
          auVar56._8_4_ = (auVar113._8_4_ + auVar113._8_4_) * fVar220;
          auVar56._12_4_ = (auVar113._12_4_ + auVar113._12_4_) * fVar220;
          auVar56._16_4_ = fVar220 * 0.0;
          auVar56._20_4_ = fVar220 * 0.0;
          auVar56._24_4_ = fVar220 * 0.0;
          auVar56._28_4_ = 0;
          auVar125 = vcmpps_avx(local_600,auVar56,6);
          auVar127 = auVar176 & auVar125;
          auVar219 = ZEXT3264(local_720);
          auVar199 = ZEXT3264(auVar209);
          if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar127 >> 0x7f,0) != '\0') ||
                (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar127 >> 0xbf,0) != '\0') ||
              (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar127[0x1f] < '\0') {
            auVar137._8_4_ = 0xbf800000;
            auVar137._0_8_ = 0xbf800000bf800000;
            auVar137._12_4_ = 0xbf800000;
            auVar137._16_4_ = 0xbf800000;
            auVar137._20_4_ = 0xbf800000;
            auVar137._24_4_ = 0xbf800000;
            auVar137._28_4_ = 0xbf800000;
            auVar157._8_4_ = 0x40000000;
            auVar157._0_8_ = 0x4000000040000000;
            auVar157._12_4_ = 0x40000000;
            auVar157._16_4_ = 0x40000000;
            auVar157._20_4_ = 0x40000000;
            auVar157._24_4_ = 0x40000000;
            auVar157._28_4_ = 0x40000000;
            auVar113 = vfmadd213ps_fma(local_500,auVar157,auVar137);
            local_420 = _local_2a0;
            local_400 = ZEXT1632(auVar113);
            local_3e0 = local_600;
            local_3c0 = 0;
            local_500 = local_400;
            if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              local_6a0 = vandps_avx(auVar125,auVar176);
              fVar220 = 1.0 / auVar119._0_4_;
              local_340[0] = fVar220 * ((float)local_2a0._0_4_ + 0.0);
              local_340[1] = fVar220 * ((float)local_2a0._4_4_ + 1.0);
              local_340[2] = fVar220 * (fStack_298 + 2.0);
              local_340[3] = fVar220 * (fStack_294 + 3.0);
              fStack_330 = fVar220 * (fStack_290 + 4.0);
              fStack_32c = fVar220 * (fStack_28c + 5.0);
              fStack_328 = fVar220 * (fStack_288 + 6.0);
              fStack_324 = fStack_284 + 7.0;
              local_500._0_8_ = auVar113._0_8_;
              local_500._8_8_ = auVar113._8_8_;
              local_320 = local_500._0_8_;
              uStack_318 = local_500._8_8_;
              uStack_310 = 0;
              uStack_308 = 0;
              local_300 = local_600;
              auVar138._8_4_ = 0x7f800000;
              auVar138._0_8_ = 0x7f8000007f800000;
              auVar138._12_4_ = 0x7f800000;
              auVar138._16_4_ = 0x7f800000;
              auVar138._20_4_ = 0x7f800000;
              auVar138._24_4_ = 0x7f800000;
              auVar138._28_4_ = 0x7f800000;
              auVar125 = vblendvps_avx(auVar138,local_600,local_6a0);
              auVar127 = vshufps_avx(auVar125,auVar125,0xb1);
              auVar127 = vminps_avx(auVar125,auVar127);
              auVar182 = vshufpd_avx(auVar127,auVar127,5);
              auVar127 = vminps_avx(auVar127,auVar182);
              auVar182 = vpermpd_avx2(auVar127,0x4e);
              auVar127 = vminps_avx(auVar127,auVar182);
              auVar127 = vcmpps_avx(auVar125,auVar127,0);
              auVar182 = local_6a0 & auVar127;
              auVar125 = local_6a0;
              if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar182 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar182 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar182 >> 0x7f,0) != '\0') ||
                    (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar182 >> 0xbf,0) != '\0') ||
                  (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar182[0x1f] < '\0') {
                auVar125 = vandps_avx(auVar127,local_6a0);
              }
              uVar106 = vmovmskps_avx(auVar125);
              uVar8 = 0;
              for (; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x80000000) {
                uVar8 = uVar8 + 1;
              }
              uVar107 = (ulong)uVar8;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar220 = local_340[uVar107];
                uVar111 = *(undefined4 *)((long)&local_320 + uVar107 * 4);
                fVar221 = 1.0 - fVar220;
                auVar168 = ZEXT416((uint)(fVar220 * fVar221 * 4.0));
                auVar22 = vfnmsub213ss_fma(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),auVar168);
                auVar168 = vfmadd213ss_fma(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),auVar168);
                fVar221 = fVar221 * -fVar221 * 0.5;
                fVar222 = auVar22._0_4_ * 0.5;
                fVar223 = auVar168._0_4_ * 0.5;
                fVar224 = fVar220 * fVar220 * 0.5;
                auVar166._0_4_ = fVar224 * local_8e0;
                auVar166._4_4_ = fVar224 * fStack_8dc;
                auVar166._8_4_ = fVar224 * fStack_8d8;
                auVar166._12_4_ = fVar224 * fStack_8d4;
                auVar145._4_4_ = fVar223;
                auVar145._0_4_ = fVar223;
                auVar145._8_4_ = fVar223;
                auVar145._12_4_ = fVar223;
                auVar168 = vfmadd132ps_fma(auVar145,auVar166,*pauVar3);
                auVar167._4_4_ = fVar222;
                auVar167._0_4_ = fVar222;
                auVar167._8_4_ = fVar222;
                auVar167._12_4_ = fVar222;
                auVar168 = vfmadd132ps_fma(auVar167,auVar168,*pauVar2);
                auVar146._4_4_ = fVar221;
                auVar146._0_4_ = fVar221;
                auVar146._8_4_ = fVar221;
                auVar146._12_4_ = fVar221;
                auVar168 = vfmadd132ps_fma(auVar146,auVar168,*pauVar1);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar107 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar168._0_4_;
                uVar216 = vextractps_avx(auVar168,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar216;
                uVar216 = vextractps_avx(auVar168,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar216;
                *(float *)(ray + k * 4 + 0x1e0) = fVar220;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar111;
                *(uint *)(ray + k * 4 + 0x220) = uVar19;
                *(uint *)(ray + k * 4 + 0x240) = uVar104;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_800._4_4_ = uVar104;
                local_800._0_4_ = uVar104;
                local_800._8_4_ = uVar104;
                local_800._12_4_ = uVar104;
                local_800._16_4_ = uVar104;
                local_800._20_4_ = uVar104;
                local_800._24_4_ = uVar104;
                local_800._28_4_ = uVar104;
                local_700._4_4_ = uVar19;
                local_700._0_4_ = uVar19;
                local_700._8_4_ = uVar19;
                local_700._12_4_ = uVar19;
                local_700._16_4_ = uVar19;
                local_700._20_4_ = uVar19;
                local_700._24_4_ = uVar19;
                local_700._28_4_ = uVar19;
                uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
                local_780 = auVar162;
                _local_4a0 = *pauVar5;
                local_3bc = iVar105;
                local_3b0 = uVar194;
                uStack_3a8 = uVar95;
                local_3a0 = uVar96;
                uStack_398 = uVar97;
                local_390 = uVar98;
                uStack_388 = uVar99;
                local_380 = uVar100;
                uStack_378 = uVar101;
                while( true ) {
                  fVar220 = local_340[uVar107];
                  auVar115._4_4_ = fVar220;
                  auVar115._0_4_ = fVar220;
                  auVar115._8_4_ = fVar220;
                  auVar115._12_4_ = fVar220;
                  local_220._16_4_ = fVar220;
                  local_220._0_16_ = auVar115;
                  local_220._20_4_ = fVar220;
                  local_220._24_4_ = fVar220;
                  local_220._28_4_ = fVar220;
                  local_200 = *(undefined4 *)((long)&local_320 + uVar107 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar107 * 4);
                  fVar222 = 1.0 - fVar220;
                  auVar113 = ZEXT416((uint)(fVar220 * fVar222 * 4.0));
                  auVar195 = vfnmsub213ss_fma(auVar115,auVar115,auVar113);
                  auVar113 = vfmadd213ss_fma(ZEXT416((uint)fVar222),ZEXT416((uint)fVar222),auVar113)
                  ;
                  fVar221 = auVar113._0_4_ * 0.5;
                  fVar220 = fVar220 * fVar220 * 0.5;
                  auVar173._0_4_ = fVar220 * local_8e0;
                  auVar173._4_4_ = fVar220 * fStack_8dc;
                  auVar173._8_4_ = fVar220 * fStack_8d8;
                  auVar173._12_4_ = fVar220 * fStack_8d4;
                  auVar152._4_4_ = fVar221;
                  auVar152._0_4_ = fVar221;
                  auVar152._8_4_ = fVar221;
                  auVar152._12_4_ = fVar221;
                  auVar113 = vfmadd132ps_fma(auVar152,auVar173,auVar168);
                  fVar220 = auVar195._0_4_ * 0.5;
                  auVar174._4_4_ = fVar220;
                  auVar174._0_4_ = fVar220;
                  auVar174._8_4_ = fVar220;
                  auVar174._12_4_ = fVar220;
                  auVar113 = vfmadd132ps_fma(auVar174,auVar113,auVar22);
                  local_830.context = context->user;
                  fVar220 = fVar222 * -fVar222 * 0.5;
                  auVar153._4_4_ = fVar220;
                  auVar153._0_4_ = fVar220;
                  auVar153._8_4_ = fVar220;
                  auVar153._12_4_ = fVar220;
                  auVar195 = vfmadd132ps_fma(auVar153,auVar113,auVar11);
                  local_280 = auVar195._0_4_;
                  uStack_27c = local_280;
                  uStack_278 = local_280;
                  uStack_274 = local_280;
                  uStack_270 = local_280;
                  uStack_26c = local_280;
                  uStack_268 = local_280;
                  uStack_264 = local_280;
                  auVar113 = vmovshdup_avx(auVar195);
                  local_260 = auVar113._0_8_;
                  uStack_258 = local_260;
                  uStack_250 = local_260;
                  uStack_248 = local_260;
                  auVar113 = vshufps_avx(auVar195,auVar195,0xaa);
                  auVar154._0_8_ = auVar113._0_8_;
                  auVar154._8_8_ = auVar154._0_8_;
                  auVar161._16_8_ = auVar154._0_8_;
                  auVar161._0_16_ = auVar154;
                  auVar161._24_8_ = auVar154._0_8_;
                  local_240 = auVar161;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_700._0_8_;
                  uStack_1d8 = local_700._8_8_;
                  uStack_1d0 = local_700._16_8_;
                  uStack_1c8 = local_700._24_8_;
                  local_1c0 = local_800;
                  auVar125 = vpcmpeqd_avx2(local_800,local_800);
                  local_7c8[1] = auVar125;
                  *local_7c8 = auVar125;
                  local_1a0 = (local_830.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_830.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_680 = local_2e0;
                  local_830.valid = (int *)local_680;
                  local_830.geometryUserPtr = pGVar20->userPtr;
                  local_830.hit = (RTCHitN *)&local_280;
                  local_830.N = 8;
                  local_830.ray = (RTCRayN *)ray;
                  if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar161 = ZEXT1632(auVar154);
                    (*pGVar20->intersectionFilterN)(&local_830);
                    auVar230 = ZEXT3264(_local_740);
                    auVar219 = ZEXT3264(local_720);
                    auVar215 = ZEXT3264(local_780);
                    auVar199 = ZEXT3264(CONCAT428(fStack_744,
                                                  CONCAT424(fStack_748,
                                                            CONCAT420(fStack_74c,
                                                                      CONCAT416(fStack_750,
                                                                                CONCAT412(fStack_754
                                                                                          ,CONCAT48(
                                                  fStack_758,CONCAT44(fStack_75c,local_760))))))));
                  }
                  auVar127 = vpcmpeqd_avx2(local_680,_DAT_01faff00);
                  auVar182 = vpcmpeqd_avx2(auVar161,auVar161);
                  auVar125 = auVar182 & ~auVar127;
                  if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar125 >> 0x7f,0) == '\0') &&
                        (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar125 >> 0xbf,0) == '\0') &&
                      (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar125[0x1f]) {
                    auVar127 = auVar127 ^ auVar182;
                  }
                  else {
                    p_Var21 = context->args->filter;
                    if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar182 = ZEXT1632(auVar182._0_16_);
                      (*p_Var21)(&local_830);
                      auVar230 = ZEXT3264(_local_740);
                      auVar219 = ZEXT3264(local_720);
                      auVar215 = ZEXT3264(local_780);
                      auVar199 = ZEXT3264(CONCAT428(fStack_744,
                                                    CONCAT424(fStack_748,
                                                              CONCAT420(fStack_74c,
                                                                        CONCAT416(fStack_750,
                                                                                  CONCAT412(
                                                  fStack_754,
                                                  CONCAT48(fStack_758,CONCAT44(fStack_75c,local_760)
                                                          )))))));
                    }
                    auVar123 = vpcmpeqd_avx2(local_680,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar182 = vpcmpeqd_avx2(auVar182,auVar182);
                    auVar127 = auVar123 ^ auVar182;
                    auVar125 = auVar182 & ~auVar123;
                    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar125 >> 0x7f,0) != '\0') ||
                          (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar125 >> 0xbf,0) != '\0') ||
                        (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar125[0x1f] < '\0') {
                      auVar143._0_4_ = auVar123._0_4_ ^ auVar182._0_4_;
                      auVar143._4_4_ = auVar123._4_4_ ^ auVar182._4_4_;
                      auVar143._8_4_ = auVar123._8_4_ ^ auVar182._8_4_;
                      auVar143._12_4_ = auVar123._12_4_ ^ auVar182._12_4_;
                      auVar143._16_4_ = auVar123._16_4_ ^ auVar182._16_4_;
                      auVar143._20_4_ = auVar123._20_4_ ^ auVar182._20_4_;
                      auVar143._24_4_ = auVar123._24_4_ ^ auVar182._24_4_;
                      auVar143._28_4_ = auVar123._28_4_ ^ auVar182._28_4_;
                      auVar125 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])local_830.hit);
                      *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar125;
                      auVar125 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x20));
                      *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar125;
                      auVar125 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x40));
                      *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar125;
                      auVar125 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x60));
                      *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar125;
                      auVar125 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])
                                                          (local_830.hit + 0x80));
                      *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar125;
                      auVar125 = vpmaskmovd_avx2(auVar143,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xa0));
                      *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar125;
                      auVar125 = vpmaskmovd_avx2(auVar143,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xc0));
                      *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar125;
                      auVar125 = vpmaskmovd_avx2(auVar143,*(undefined1 (*) [32])
                                                           (local_830.hit + 0xe0));
                      *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar125;
                      auVar125 = vpmaskmovd_avx2(auVar143,*(undefined1 (*) [32])
                                                           (local_830.hit + 0x100));
                      *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar125;
                    }
                  }
                  auVar125 = local_600;
                  auVar162 = auVar215._0_32_;
                  if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar127 >> 0x7f,0) == '\0') &&
                        (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar127 >> 0xbf,0) == '\0') &&
                      (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar127[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar111;
                  }
                  else {
                    uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
                  }
                  *(undefined4 *)(local_6a0 + uVar107 * 4) = 0;
                  auVar129._4_4_ = uVar111;
                  auVar129._0_4_ = uVar111;
                  auVar129._8_4_ = uVar111;
                  auVar129._12_4_ = uVar111;
                  auVar129._16_4_ = uVar111;
                  auVar129._20_4_ = uVar111;
                  auVar129._24_4_ = uVar111;
                  auVar129._28_4_ = uVar111;
                  auVar182 = vcmpps_avx(auVar125,auVar129,2);
                  auVar127 = vandps_avx(auVar182,local_6a0);
                  local_6a0 = local_6a0 & auVar182;
                  if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_6a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                        (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                      (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_6a0[0x1f]) break;
                  auVar144._8_4_ = 0x7f800000;
                  auVar144._0_8_ = 0x7f8000007f800000;
                  auVar144._12_4_ = 0x7f800000;
                  auVar144._16_4_ = 0x7f800000;
                  auVar144._20_4_ = 0x7f800000;
                  auVar144._24_4_ = 0x7f800000;
                  auVar144._28_4_ = 0x7f800000;
                  auVar125 = vblendvps_avx(auVar144,auVar125,auVar127);
                  auVar182 = vshufps_avx(auVar125,auVar125,0xb1);
                  auVar182 = vminps_avx(auVar125,auVar182);
                  auVar123 = vshufpd_avx(auVar182,auVar182,5);
                  auVar182 = vminps_avx(auVar182,auVar123);
                  auVar123 = vpermpd_avx2(auVar182,0x4e);
                  auVar182 = vminps_avx(auVar182,auVar123);
                  auVar182 = vcmpps_avx(auVar125,auVar182,0);
                  auVar123 = auVar127 & auVar182;
                  auVar125 = auVar127;
                  if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar123 >> 0x7f,0) != '\0') ||
                        (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar123 >> 0xbf,0) != '\0') ||
                      (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar123[0x1f] < '\0') {
                    auVar125 = vandps_avx(auVar182,auVar127);
                  }
                  uVar106 = vmovmskps_avx(auVar125);
                  uVar8 = 0;
                  for (; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x80000000) {
                    uVar8 = uVar8 + 1;
                  }
                  uVar107 = (ulong)uVar8;
                  local_6a0 = auVar127;
                }
              }
            }
            goto LAB_0183ca7e;
          }
        }
        auVar219 = ZEXT3264(local_720);
        auVar199 = ZEXT3264(auVar209);
      }
LAB_0183ca7e:
      if (8 < iVar105) {
        _local_740 = auVar230._0_32_;
        local_480._4_4_ = iVar105;
        local_480._0_4_ = iVar105;
        local_480._8_4_ = iVar105;
        local_480._12_4_ = iVar105;
        local_480._16_4_ = iVar105;
        local_480._20_4_ = iVar105;
        local_480._24_4_ = iVar105;
        local_480._28_4_ = iVar105;
        local_4c0._4_4_ = fVar217;
        local_4c0._0_4_ = fVar217;
        fStack_4b8 = fVar217;
        fStack_4b4 = fVar217;
        fStack_4b0 = fVar217;
        fStack_4ac = fVar217;
        fStack_4a8 = fVar217;
        fStack_4a4 = fVar217;
        local_4e0._4_4_ = local_7c0._0_4_;
        local_4e0._0_4_ = local_7c0._0_4_;
        local_4e0._8_4_ = local_7c0._0_4_;
        local_4e0._12_4_ = local_7c0._0_4_;
        local_4e0._16_4_ = local_7c0._0_4_;
        local_4e0._20_4_ = local_7c0._0_4_;
        local_4e0._24_4_ = local_7c0._0_4_;
        local_4e0._28_4_ = local_7c0._0_4_;
        local_160 = 1.0 / local_5a0;
        fStack_15c = local_160;
        fStack_158 = local_160;
        fStack_154 = local_160;
        fStack_150 = local_160;
        fStack_14c = local_160;
        fStack_148 = local_160;
        fStack_144 = local_160;
        local_140 = uVar19;
        uStack_13c = uVar19;
        uStack_138 = uVar19;
        uStack_134 = uVar19;
        uStack_130 = uVar19;
        uStack_12c = uVar19;
        uStack_128 = uVar19;
        uStack_124 = uVar19;
        lVar110 = 8;
        local_720 = auVar219._0_32_;
        local_780 = auVar162;
        local_5a0 = (float)uVar104;
        uStack_59c = uVar104;
        uStack_598 = uVar104;
        uStack_594 = uVar104;
        uStack_590 = uVar104;
        uStack_58c = uVar104;
        uStack_588 = uVar104;
        uStack_584 = uVar104;
        do {
          auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar110 * 4 + lVar28);
          auVar127 = *(undefined1 (*) [32])(lVar28 + 0x21aefac + lVar110 * 4);
          auVar182 = *(undefined1 (*) [32])(lVar28 + 0x21af430 + lVar110 * 4);
          pauVar6 = (undefined1 (*) [28])(lVar28 + 0x21af8b4 + lVar110 * 4);
          fVar183 = *(float *)*pauVar6;
          fVar88 = *(float *)(*pauVar6 + 4);
          fVar89 = *(float *)(*pauVar6 + 8);
          fVar90 = *(float *)(*pauVar6 + 0xc);
          fVar91 = *(float *)(*pauVar6 + 0x10);
          fVar92 = *(float *)(*pauVar6 + 0x14);
          fVar93 = *(float *)(*pauVar6 + 0x18);
          auVar102 = *pauVar6;
          auVar215._0_4_ = local_540 * fVar183;
          auVar215._4_4_ = fStack_53c * fVar88;
          auVar215._8_4_ = fStack_538 * fVar89;
          auVar215._12_4_ = fStack_534 * fVar90;
          auVar215._16_4_ = fStack_530 * fVar91;
          auVar215._20_4_ = fStack_52c * fVar92;
          auVar215._28_36_ = auVar219._28_36_;
          auVar215._24_4_ = fStack_528 * fVar93;
          fVar193 = auVar199._0_4_;
          auVar231._0_4_ = fVar193 * fVar183;
          fVar200 = auVar199._4_4_;
          auVar231._4_4_ = fVar200 * fVar88;
          fVar201 = auVar199._8_4_;
          auVar231._8_4_ = fVar201 * fVar89;
          fVar202 = auVar199._12_4_;
          auVar231._12_4_ = fVar202 * fVar90;
          fVar203 = auVar199._16_4_;
          auVar231._16_4_ = fVar203 * fVar91;
          fVar204 = auVar199._20_4_;
          auVar231._20_4_ = fVar204 * fVar92;
          fVar205 = auVar199._24_4_;
          auVar231._28_36_ = auVar230._28_36_;
          auVar231._24_4_ = fVar205 * fVar93;
          auVar168 = vfmadd231ps_fma(auVar215._0_32_,auVar182,local_7a0);
          auVar22 = vfmadd231ps_fma(auVar231._0_32_,auVar182,local_6c0);
          auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar127,auVar245);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar127,local_580);
          auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar125,auVar240);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar125,local_560);
          auVar123 = *(undefined1 (*) [32])(bspline_basis1 + lVar110 * 4 + lVar28);
          auVar136 = *(undefined1 (*) [32])(lVar28 + 0x21b13cc + lVar110 * 4);
          auVar25 = *(undefined1 (*) [32])(lVar28 + 0x21b1850 + lVar110 * 4);
          pfVar7 = (float *)(lVar28 + 0x21b1cd4 + lVar110 * 4);
          fVar94 = *pfVar7;
          fVar226 = pfVar7[1];
          fVar232 = pfVar7[2];
          fVar234 = pfVar7[3];
          fVar235 = pfVar7[4];
          fVar236 = pfVar7[5];
          fVar237 = pfVar7[6];
          auVar57._4_4_ = fVar226 * fStack_53c;
          auVar57._0_4_ = fVar94 * local_540;
          auVar57._8_4_ = fVar232 * fStack_538;
          auVar57._12_4_ = fVar234 * fStack_534;
          auVar57._16_4_ = fVar235 * fStack_530;
          auVar57._20_4_ = fVar236 * fStack_52c;
          auVar57._24_4_ = fVar237 * fStack_528;
          auVar57._28_4_ = auVar127._28_4_;
          auVar58._4_4_ = fVar226 * fVar200;
          auVar58._0_4_ = fVar94 * fVar193;
          auVar58._8_4_ = fVar232 * fVar201;
          auVar58._12_4_ = fVar234 * fVar202;
          auVar58._16_4_ = fVar235 * fVar203;
          auVar58._20_4_ = fVar236 * fVar204;
          auVar58._24_4_ = fVar237 * fVar205;
          auVar58._28_4_ = fStack_524;
          auVar11 = vfmadd231ps_fma(auVar57,auVar25,local_7a0);
          auVar113 = vfmadd231ps_fma(auVar58,auVar25,local_6c0);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar136,auVar245);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar136,local_580);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar123,auVar240);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar123,local_560);
          local_460 = ZEXT1632(auVar11);
          local_700 = ZEXT1632(auVar168);
          auVar26 = vsubps_avx(local_460,local_700);
          auVar131 = ZEXT1632(auVar113);
          local_5c0 = ZEXT1632(auVar22);
          auVar27 = vsubps_avx(auVar131,local_5c0);
          auVar87._4_4_ = auVar22._4_4_ * auVar26._4_4_;
          auVar87._0_4_ = auVar22._0_4_ * auVar26._0_4_;
          auVar87._8_4_ = auVar22._8_4_ * auVar26._8_4_;
          auVar87._12_4_ = auVar22._12_4_ * auVar26._12_4_;
          auVar87._16_4_ = auVar26._16_4_ * 0.0;
          auVar87._20_4_ = auVar26._20_4_ * 0.0;
          auVar87._24_4_ = auVar26._24_4_ * 0.0;
          auVar87._28_4_ = local_580._28_4_;
          auVar230 = ZEXT3264(auVar182);
          fVar217 = auVar27._0_4_;
          fVar220 = auVar27._4_4_;
          auVar86._4_4_ = auVar168._4_4_ * fVar220;
          auVar86._0_4_ = auVar168._0_4_ * fVar217;
          fVar221 = auVar27._8_4_;
          auVar86._8_4_ = auVar168._8_4_ * fVar221;
          fVar222 = auVar27._12_4_;
          auVar86._12_4_ = auVar168._12_4_ * fVar222;
          fVar223 = auVar27._16_4_;
          auVar86._16_4_ = fVar223 * 0.0;
          fVar224 = auVar27._20_4_;
          auVar86._20_4_ = fVar224 * 0.0;
          fVar225 = auVar27._24_4_;
          auVar86._24_4_ = fVar225 * 0.0;
          auVar86._28_4_ = local_7a0._28_4_;
          auVar24 = vsubps_avx(auVar87,auVar86);
          auVar59._4_4_ = local_100._4_4_ * fVar88;
          auVar59._0_4_ = (float)local_100 * fVar183;
          auVar59._8_4_ = (float)uStack_f8 * fVar89;
          auVar59._12_4_ = uStack_f8._4_4_ * fVar90;
          auVar59._16_4_ = (float)uStack_f0 * fVar91;
          auVar59._20_4_ = uStack_f0._4_4_ * fVar92;
          auVar59._24_4_ = (float)uStack_e8 * fVar93;
          auVar59._28_4_ = local_580._28_4_;
          auVar168 = vfmadd231ps_fma(auVar59,auVar182,local_e0);
          auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),local_c0,auVar127);
          auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),local_a0,auVar125);
          auVar60._4_4_ = fVar226 * local_100._4_4_;
          auVar60._0_4_ = fVar94 * (float)local_100;
          auVar60._8_4_ = fVar232 * (float)uStack_f8;
          auVar60._12_4_ = fVar234 * uStack_f8._4_4_;
          auVar60._16_4_ = fVar235 * (float)uStack_f0;
          auVar60._20_4_ = fVar236 * uStack_f0._4_4_;
          auVar60._24_4_ = fVar237 * (float)uStack_e8;
          auVar60._28_4_ = uStack_e8._4_4_;
          auVar22 = vfmadd231ps_fma(auVar60,auVar25,local_e0);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar136,local_c0);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar123,local_a0);
          auVar103._4_4_ = fVar220 * fVar220;
          auVar103._0_4_ = fVar217 * fVar217;
          auVar103._8_4_ = fVar221 * fVar221;
          auVar103._12_4_ = fVar222 * fVar222;
          auVar103._16_4_ = fVar223 * fVar223;
          auVar103._20_4_ = fVar224 * fVar224;
          auVar103._24_4_ = fVar225 * fVar225;
          auVar103._28_4_ = uVar192;
          auVar11 = vfmadd231ps_fma(auVar103,auVar26,auVar26);
          auVar158 = vmaxps_avx(ZEXT1632(auVar168),ZEXT1632(auVar22));
          fVar217 = auVar158._0_4_ * auVar158._0_4_;
          fVar220 = auVar158._4_4_ * auVar158._4_4_;
          fVar221 = auVar158._8_4_ * auVar158._8_4_;
          fVar222 = auVar158._12_4_ * auVar158._12_4_;
          fVar223 = auVar158._16_4_ * auVar158._16_4_;
          fVar224 = auVar158._20_4_ * auVar158._20_4_;
          fVar225 = auVar158._24_4_ * auVar158._24_4_;
          auVar219 = ZEXT3264(CONCAT428(auVar158._28_4_,
                                        CONCAT424(fVar225,CONCAT420(fVar224,CONCAT416(fVar223,
                                                  CONCAT412(fVar222,CONCAT48(fVar221,CONCAT44(
                                                  fVar220,fVar217))))))));
          auVar210._0_4_ = fVar217 * auVar11._0_4_;
          auVar210._4_4_ = fVar220 * auVar11._4_4_;
          auVar210._8_4_ = fVar221 * auVar11._8_4_;
          auVar210._12_4_ = fVar222 * auVar11._12_4_;
          auVar210._16_4_ = fVar223 * 0.0;
          auVar210._20_4_ = fVar224 * 0.0;
          auVar210._24_4_ = fVar225 * 0.0;
          auVar210._28_4_ = 0;
          auVar61._4_4_ = auVar24._4_4_ * auVar24._4_4_;
          auVar61._0_4_ = auVar24._0_4_ * auVar24._0_4_;
          auVar61._8_4_ = auVar24._8_4_ * auVar24._8_4_;
          auVar61._12_4_ = auVar24._12_4_ * auVar24._12_4_;
          auVar61._16_4_ = auVar24._16_4_ * auVar24._16_4_;
          auVar61._20_4_ = auVar24._20_4_ * auVar24._20_4_;
          auVar61._24_4_ = auVar24._24_4_ * auVar24._24_4_;
          auVar61._28_4_ = auVar24._28_4_;
          auVar158 = vcmpps_avx(auVar61,auVar210,2);
          local_3c0 = (int)lVar110;
          auVar211._4_4_ = local_3c0;
          auVar211._0_4_ = local_3c0;
          auVar211._8_4_ = local_3c0;
          auVar211._12_4_ = local_3c0;
          auVar211._16_4_ = local_3c0;
          auVar211._20_4_ = local_3c0;
          auVar211._24_4_ = local_3c0;
          auVar211._28_4_ = local_3c0;
          auVar24 = vpor_avx2(auVar211,_DAT_01fe9900);
          auVar117 = vpcmpgtd_avx2(local_480,auVar24);
          auVar24 = auVar117 & auVar158;
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar24 >> 0x7f,0) == '\0') &&
                (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar24 >> 0xbf,0) == '\0') &&
              (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar24[0x1f]) {
            auVar199 = ZEXT3264(auVar199._0_32_);
          }
          else {
            _local_4a0 = vandps_avx(auVar117,auVar158);
            auVar62._4_4_ = fVar226 * (float)local_740._4_4_;
            auVar62._0_4_ = fVar94 * (float)local_740._0_4_;
            auVar62._8_4_ = fVar232 * fStack_738;
            auVar62._12_4_ = fVar234 * fStack_734;
            auVar62._16_4_ = fVar235 * fStack_730;
            auVar62._20_4_ = fVar236 * fStack_72c;
            auVar62._24_4_ = fVar237 * fStack_728;
            auVar62._28_4_ = auVar158._28_4_;
            auVar11 = vfmadd213ps_fma(auVar25,local_720,auVar62);
            auVar11 = vfmadd213ps_fma(auVar136,local_780,ZEXT1632(auVar11));
            auVar11 = vfmadd132ps_fma(auVar123,ZEXT1632(auVar11),local_6e0);
            local_5e0._0_4_ = auVar102._0_4_;
            local_5e0._4_4_ = auVar102._4_4_;
            fStack_5d8 = auVar102._8_4_;
            fStack_5d4 = auVar102._12_4_;
            fStack_5d0 = auVar102._16_4_;
            fStack_5cc = auVar102._20_4_;
            fStack_5c8 = auVar102._24_4_;
            auVar63._4_4_ = (float)local_740._4_4_ * (float)local_5e0._4_4_;
            auVar63._0_4_ = (float)local_740._0_4_ * (float)local_5e0._0_4_;
            auVar63._8_4_ = fStack_738 * fStack_5d8;
            auVar63._12_4_ = fStack_734 * fStack_5d4;
            auVar63._16_4_ = fStack_730 * fStack_5d0;
            auVar63._20_4_ = fStack_72c * fStack_5cc;
            auVar63._24_4_ = fStack_728 * fStack_5c8;
            auVar63._28_4_ = auVar158._28_4_;
            auVar113 = vfmadd213ps_fma(auVar182,local_720,auVar63);
            auVar113 = vfmadd213ps_fma(auVar127,local_780,ZEXT1632(auVar113));
            auVar127 = *(undefined1 (*) [32])(lVar28 + 0x21afd38 + lVar110 * 4);
            auVar182 = *(undefined1 (*) [32])(lVar28 + 0x21b01bc + lVar110 * 4);
            auVar123 = *(undefined1 (*) [32])(lVar28 + 0x21b0640 + lVar110 * 4);
            pfVar7 = (float *)(lVar28 + 0x21b0ac4 + lVar110 * 4);
            fVar217 = *pfVar7;
            fVar220 = pfVar7[1];
            fVar221 = pfVar7[2];
            fVar222 = pfVar7[3];
            fVar223 = pfVar7[4];
            fVar224 = pfVar7[5];
            fVar225 = pfVar7[6];
            auVar64._4_4_ = fVar220 * fStack_53c;
            auVar64._0_4_ = fVar217 * local_540;
            auVar64._8_4_ = fVar221 * fStack_538;
            auVar64._12_4_ = fVar222 * fStack_534;
            auVar64._16_4_ = fVar223 * fStack_530;
            auVar64._20_4_ = fVar224 * fStack_52c;
            auVar64._24_4_ = fVar225 * fStack_528;
            auVar64._28_4_ = auVar26._28_4_;
            auVar228._0_4_ = fVar193 * fVar217;
            auVar228._4_4_ = fVar200 * fVar220;
            auVar228._8_4_ = fVar201 * fVar221;
            auVar228._12_4_ = fVar202 * fVar222;
            auVar228._16_4_ = fVar203 * fVar223;
            auVar228._20_4_ = fVar204 * fVar224;
            auVar228._24_4_ = fVar205 * fVar225;
            auVar228._28_4_ = 0;
            auVar65._4_4_ = fVar220 * (float)local_740._4_4_;
            auVar65._0_4_ = fVar217 * (float)local_740._0_4_;
            auVar65._8_4_ = fVar221 * fStack_738;
            auVar65._12_4_ = fVar222 * fStack_734;
            auVar65._16_4_ = fVar223 * fStack_730;
            auVar65._20_4_ = fVar224 * fStack_72c;
            auVar65._24_4_ = fVar225 * fStack_728;
            auVar65._28_4_ = pfVar7[7];
            auVar195 = vfmadd231ps_fma(auVar64,auVar123,local_7a0);
            auVar23 = vfmadd231ps_fma(auVar228,auVar123,local_6c0);
            auVar115 = vfmadd231ps_fma(auVar65,local_720,auVar123);
            auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar182,auVar245);
            auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar182,local_580);
            auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),local_780,auVar182);
            auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar127,auVar240);
            auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar127,local_560);
            auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar127,local_6e0);
            pfVar7 = (float *)(lVar28 + 0x21b2ee4 + lVar110 * 4);
            fVar217 = *pfVar7;
            fVar220 = pfVar7[1];
            fVar221 = pfVar7[2];
            fVar222 = pfVar7[3];
            fVar223 = pfVar7[4];
            fVar224 = pfVar7[5];
            fVar225 = pfVar7[6];
            auVar66._4_4_ = fStack_53c * fVar220;
            auVar66._0_4_ = local_540 * fVar217;
            auVar66._8_4_ = fStack_538 * fVar221;
            auVar66._12_4_ = fStack_534 * fVar222;
            auVar66._16_4_ = fStack_530 * fVar223;
            auVar66._20_4_ = fStack_52c * fVar224;
            auVar66._24_4_ = fStack_528 * fVar225;
            auVar66._28_4_ = auVar27._28_4_;
            auVar67._4_4_ = fVar200 * fVar220;
            auVar67._0_4_ = fVar193 * fVar217;
            auVar67._8_4_ = fVar201 * fVar221;
            auVar67._12_4_ = fVar202 * fVar222;
            auVar67._16_4_ = fVar203 * fVar223;
            auVar67._20_4_ = fVar204 * fVar224;
            auVar67._24_4_ = fVar205 * fVar225;
            auVar67._28_4_ = local_780._28_4_;
            auVar68._4_4_ = fVar220 * (float)local_740._4_4_;
            auVar68._0_4_ = fVar217 * (float)local_740._0_4_;
            auVar68._8_4_ = fVar221 * fStack_738;
            auVar68._12_4_ = fVar222 * fStack_734;
            auVar68._16_4_ = fVar223 * fStack_730;
            auVar68._20_4_ = fVar224 * fStack_72c;
            auVar68._24_4_ = fVar225 * fStack_728;
            auVar68._28_4_ = pfVar7[7];
            auVar127 = *(undefined1 (*) [32])(lVar28 + 0x21b2a60 + lVar110 * 4);
            auVar165 = vfmadd231ps_fma(auVar66,auVar127,local_7a0);
            auVar184 = vfmadd231ps_fma(auVar67,auVar127,local_6c0);
            auVar185 = vfmadd231ps_fma(auVar68,auVar127,local_720);
            auVar127 = *(undefined1 (*) [32])(lVar28 + 0x21b25dc + lVar110 * 4);
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar127,auVar245);
            auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),auVar127,local_580);
            auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar127,local_780);
            auVar127 = *(undefined1 (*) [32])(lVar28 + 0x21b2158 + lVar110 * 4);
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar127,auVar240);
            auVar184 = vfmadd231ps_fma(ZEXT1632(auVar184),auVar127,local_560);
            auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),local_6e0,auVar127);
            auVar127 = vandps_avx(ZEXT1632(auVar195),local_2c0);
            auVar182 = vandps_avx(ZEXT1632(auVar23),local_2c0);
            auVar182 = vmaxps_avx(auVar127,auVar182);
            auVar127 = vandps_avx(ZEXT1632(auVar115),local_2c0);
            auVar127 = vmaxps_avx(auVar182,auVar127);
            auVar127 = vcmpps_avx(auVar127,_local_4c0,1);
            auVar123 = vblendvps_avx(ZEXT1632(auVar195),auVar26,auVar127);
            auVar136 = vblendvps_avx(ZEXT1632(auVar23),auVar27,auVar127);
            auVar127 = vandps_avx(ZEXT1632(auVar165),local_2c0);
            auVar182 = vandps_avx(ZEXT1632(auVar184),local_2c0);
            auVar182 = vmaxps_avx(auVar127,auVar182);
            auVar127 = vandps_avx(local_2c0,ZEXT1632(auVar185));
            auVar127 = vmaxps_avx(auVar182,auVar127);
            auVar182 = vcmpps_avx(auVar127,_local_4c0,1);
            auVar127 = vblendvps_avx(ZEXT1632(auVar165),auVar26,auVar182);
            auVar182 = vblendvps_avx(ZEXT1632(auVar184),auVar27,auVar182);
            auVar113 = vfmadd213ps_fma(auVar125,local_6e0,ZEXT1632(auVar113));
            auVar195 = vfmadd213ps_fma(auVar123,auVar123,ZEXT832(0) << 0x20);
            auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar136,auVar136);
            auVar125 = vrsqrtps_avx(ZEXT1632(auVar195));
            fVar217 = auVar125._0_4_;
            fVar220 = auVar125._4_4_;
            fVar221 = auVar125._8_4_;
            fVar222 = auVar125._12_4_;
            fVar223 = auVar125._16_4_;
            fVar224 = auVar125._20_4_;
            fVar225 = auVar125._24_4_;
            auVar69._4_4_ = fVar220 * fVar220 * fVar220 * auVar195._4_4_ * -0.5;
            auVar69._0_4_ = fVar217 * fVar217 * fVar217 * auVar195._0_4_ * -0.5;
            auVar69._8_4_ = fVar221 * fVar221 * fVar221 * auVar195._8_4_ * -0.5;
            auVar69._12_4_ = fVar222 * fVar222 * fVar222 * auVar195._12_4_ * -0.5;
            auVar69._16_4_ = fVar223 * fVar223 * fVar223 * -0.0;
            auVar69._20_4_ = fVar224 * fVar224 * fVar224 * -0.0;
            auVar69._24_4_ = fVar225 * fVar225 * fVar225 * -0.0;
            auVar69._28_4_ = 0;
            auVar242._8_4_ = 0x3fc00000;
            auVar242._0_8_ = 0x3fc000003fc00000;
            auVar242._12_4_ = 0x3fc00000;
            auVar242._16_4_ = 0x3fc00000;
            auVar242._20_4_ = 0x3fc00000;
            auVar242._24_4_ = 0x3fc00000;
            auVar242._28_4_ = 0x3fc00000;
            auVar195 = vfmadd231ps_fma(auVar69,auVar242,auVar125);
            fVar217 = auVar195._0_4_;
            fVar220 = auVar195._4_4_;
            auVar70._4_4_ = auVar136._4_4_ * fVar220;
            auVar70._0_4_ = auVar136._0_4_ * fVar217;
            fVar221 = auVar195._8_4_;
            auVar70._8_4_ = auVar136._8_4_ * fVar221;
            fVar222 = auVar195._12_4_;
            auVar70._12_4_ = auVar136._12_4_ * fVar222;
            auVar70._16_4_ = auVar136._16_4_ * 0.0;
            auVar70._20_4_ = auVar136._20_4_ * 0.0;
            auVar70._24_4_ = auVar136._24_4_ * 0.0;
            auVar70._28_4_ = auVar136._28_4_;
            auVar71._4_4_ = fVar220 * -auVar123._4_4_;
            auVar71._0_4_ = fVar217 * -auVar123._0_4_;
            auVar71._8_4_ = fVar221 * -auVar123._8_4_;
            auVar71._12_4_ = fVar222 * -auVar123._12_4_;
            auVar71._16_4_ = -auVar123._16_4_ * 0.0;
            auVar71._20_4_ = -auVar123._20_4_ * 0.0;
            auVar71._24_4_ = -auVar123._24_4_ * 0.0;
            auVar71._28_4_ = auVar125._28_4_;
            auVar195 = vfmadd213ps_fma(auVar127,auVar127,ZEXT832(0) << 0x20);
            auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar182,auVar182);
            auVar125 = vrsqrtps_avx(ZEXT1632(auVar195));
            auVar72._28_4_ = uVar192;
            auVar72._0_28_ =
                 ZEXT1628(CONCAT412(fVar222 * 0.0,
                                    CONCAT48(fVar221 * 0.0,CONCAT44(fVar220 * 0.0,fVar217 * 0.0))));
            fVar217 = auVar125._0_4_;
            fVar220 = auVar125._4_4_;
            fVar221 = auVar125._8_4_;
            fVar222 = auVar125._12_4_;
            fVar223 = auVar125._16_4_;
            fVar224 = auVar125._20_4_;
            fVar225 = auVar125._24_4_;
            auVar73._4_4_ = fVar220 * fVar220 * fVar220 * auVar195._4_4_ * -0.5;
            auVar73._0_4_ = fVar217 * fVar217 * fVar217 * auVar195._0_4_ * -0.5;
            auVar73._8_4_ = fVar221 * fVar221 * fVar221 * auVar195._8_4_ * -0.5;
            auVar73._12_4_ = fVar222 * fVar222 * fVar222 * auVar195._12_4_ * -0.5;
            auVar73._16_4_ = fVar223 * fVar223 * fVar223 * -0.0;
            auVar73._20_4_ = fVar224 * fVar224 * fVar224 * -0.0;
            auVar73._24_4_ = fVar225 * fVar225 * fVar225 * -0.0;
            auVar73._28_4_ = 0;
            auVar195 = vfmadd231ps_fma(auVar73,auVar242,auVar125);
            fVar217 = auVar195._0_4_;
            auVar233._0_4_ = auVar182._0_4_ * fVar217;
            fVar220 = auVar195._4_4_;
            auVar233._4_4_ = auVar182._4_4_ * fVar220;
            fVar221 = auVar195._8_4_;
            auVar233._8_4_ = auVar182._8_4_ * fVar221;
            fVar222 = auVar195._12_4_;
            auVar233._12_4_ = auVar182._12_4_ * fVar222;
            auVar233._16_4_ = auVar182._16_4_ * 0.0;
            auVar233._20_4_ = auVar182._20_4_ * 0.0;
            auVar233._24_4_ = auVar182._24_4_ * 0.0;
            auVar233._28_4_ = 0;
            auVar74._4_4_ = fVar220 * -auVar127._4_4_;
            auVar74._0_4_ = fVar217 * -auVar127._0_4_;
            auVar74._8_4_ = fVar221 * -auVar127._8_4_;
            auVar74._12_4_ = fVar222 * -auVar127._12_4_;
            auVar74._16_4_ = -auVar127._16_4_ * 0.0;
            auVar74._20_4_ = -auVar127._20_4_ * 0.0;
            auVar74._24_4_ = -auVar127._24_4_ * 0.0;
            auVar74._28_4_ = auVar125._28_4_;
            auVar75._28_4_ = 0xbf000000;
            auVar75._0_28_ =
                 ZEXT1628(CONCAT412(fVar222 * 0.0,
                                    CONCAT48(fVar221 * 0.0,CONCAT44(fVar220 * 0.0,fVar217 * 0.0))));
            auVar195 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar168),local_700);
            auVar125 = ZEXT1632(auVar168);
            auVar23 = vfmadd213ps_fma(auVar71,auVar125,local_5c0);
            auVar115 = vfmadd213ps_fma(auVar72,auVar125,ZEXT1632(auVar113));
            auVar185 = vfnmadd213ps_fma(auVar70,auVar125,local_700);
            auVar165 = vfmadd213ps_fma(auVar233,ZEXT1632(auVar22),local_460);
            auVar196 = vfnmadd213ps_fma(auVar71,auVar125,local_5c0);
            auVar125 = ZEXT1632(auVar22);
            auVar184 = vfmadd213ps_fma(auVar74,auVar125,auVar131);
            auVar126 = ZEXT1632(auVar168);
            auVar168 = vfnmadd231ps_fma(ZEXT1632(auVar113),auVar126,auVar72);
            auVar113 = vfmadd213ps_fma(auVar75,auVar125,ZEXT1632(auVar11));
            auVar197 = vfnmadd213ps_fma(auVar233,auVar125,local_460);
            auVar29 = vfnmadd213ps_fma(auVar74,auVar125,auVar131);
            auVar30 = vfnmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar22),auVar75);
            auVar125 = vsubps_avx(ZEXT1632(auVar184),ZEXT1632(auVar196));
            auVar127 = vsubps_avx(ZEXT1632(auVar113),ZEXT1632(auVar168));
            auVar190._0_4_ = auVar125._0_4_ * auVar168._0_4_;
            auVar190._4_4_ = auVar125._4_4_ * auVar168._4_4_;
            auVar190._8_4_ = auVar125._8_4_ * auVar168._8_4_;
            auVar190._12_4_ = auVar125._12_4_ * auVar168._12_4_;
            auVar190._16_4_ = auVar125._16_4_ * 0.0;
            auVar190._20_4_ = auVar125._20_4_ * 0.0;
            auVar190._24_4_ = auVar125._24_4_ * 0.0;
            auVar190._28_4_ = 0;
            auVar11 = vfmsub231ps_fma(auVar190,ZEXT1632(auVar196),auVar127);
            auVar76._4_4_ = auVar185._4_4_ * auVar127._4_4_;
            auVar76._0_4_ = auVar185._0_4_ * auVar127._0_4_;
            auVar76._8_4_ = auVar185._8_4_ * auVar127._8_4_;
            auVar76._12_4_ = auVar185._12_4_ * auVar127._12_4_;
            auVar76._16_4_ = auVar127._16_4_ * 0.0;
            auVar76._20_4_ = auVar127._20_4_ * 0.0;
            auVar76._24_4_ = auVar127._24_4_ * 0.0;
            auVar76._28_4_ = auVar127._28_4_;
            auVar136 = ZEXT1632(auVar185);
            auVar127 = vsubps_avx(ZEXT1632(auVar165),auVar136);
            auVar158 = ZEXT1632(auVar168);
            auVar168 = vfmsub231ps_fma(auVar76,auVar158,auVar127);
            auVar77._4_4_ = auVar196._4_4_ * auVar127._4_4_;
            auVar77._0_4_ = auVar196._0_4_ * auVar127._0_4_;
            auVar77._8_4_ = auVar196._8_4_ * auVar127._8_4_;
            auVar77._12_4_ = auVar196._12_4_ * auVar127._12_4_;
            auVar77._16_4_ = auVar127._16_4_ * 0.0;
            auVar77._20_4_ = auVar127._20_4_ * 0.0;
            auVar77._24_4_ = auVar127._24_4_ * 0.0;
            auVar77._28_4_ = auVar127._28_4_;
            auVar185 = vfmsub231ps_fma(auVar77,auVar136,auVar125);
            auVar125 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar168 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar125,ZEXT1632(auVar168));
            auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar125,ZEXT1632(auVar11));
            auVar26 = vcmpps_avx(ZEXT1632(auVar168),ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar125 = vblendvps_avx(ZEXT1632(auVar197),ZEXT1632(auVar195),auVar26);
            local_7c0 = vblendvps_avx(ZEXT1632(auVar29),ZEXT1632(auVar23),auVar26);
            local_800 = vblendvps_avx(ZEXT1632(auVar30),ZEXT1632(auVar115),auVar26);
            auVar127 = vblendvps_avx(auVar136,ZEXT1632(auVar165),auVar26);
            auVar182 = vblendvps_avx(ZEXT1632(auVar196),ZEXT1632(auVar184),auVar26);
            auVar123 = vblendvps_avx(auVar158,ZEXT1632(auVar113),auVar26);
            auVar136 = vblendvps_avx(ZEXT1632(auVar165),auVar136,auVar26);
            auVar25 = vblendvps_avx(ZEXT1632(auVar184),ZEXT1632(auVar196),auVar26);
            auVar168 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
            auVar158 = vblendvps_avx(ZEXT1632(auVar113),auVar158,auVar26);
            auVar136 = vsubps_avx(auVar136,auVar125);
            auVar25 = vsubps_avx(auVar25,local_7c0);
            auVar24 = vsubps_avx(auVar158,local_800);
            auVar117 = vsubps_avx(auVar125,auVar127);
            auVar131 = vsubps_avx(local_7c0,auVar182);
            auVar219 = ZEXT3264(auVar131);
            auVar155 = vsubps_avx(local_800,auVar123);
            auVar179._0_4_ = auVar24._0_4_ * auVar125._0_4_;
            auVar179._4_4_ = auVar24._4_4_ * auVar125._4_4_;
            auVar179._8_4_ = auVar24._8_4_ * auVar125._8_4_;
            auVar179._12_4_ = auVar24._12_4_ * auVar125._12_4_;
            auVar179._16_4_ = auVar24._16_4_ * auVar125._16_4_;
            auVar179._20_4_ = auVar24._20_4_ * auVar125._20_4_;
            auVar179._24_4_ = auVar24._24_4_ * auVar125._24_4_;
            auVar179._28_4_ = 0;
            auVar11 = vfmsub231ps_fma(auVar179,local_800,auVar136);
            auVar78._4_4_ = auVar136._4_4_ * local_7c0._4_4_;
            auVar78._0_4_ = auVar136._0_4_ * local_7c0._0_4_;
            auVar78._8_4_ = auVar136._8_4_ * local_7c0._8_4_;
            auVar78._12_4_ = auVar136._12_4_ * local_7c0._12_4_;
            auVar78._16_4_ = auVar136._16_4_ * local_7c0._16_4_;
            auVar78._20_4_ = auVar136._20_4_ * local_7c0._20_4_;
            auVar78._24_4_ = auVar136._24_4_ * local_7c0._24_4_;
            auVar78._28_4_ = auVar158._28_4_;
            auVar113 = vfmsub231ps_fma(auVar78,auVar125,auVar25);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar113),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
            auVar180._0_4_ = local_800._0_4_ * auVar25._0_4_;
            auVar180._4_4_ = local_800._4_4_ * auVar25._4_4_;
            auVar180._8_4_ = local_800._8_4_ * auVar25._8_4_;
            auVar180._12_4_ = local_800._12_4_ * auVar25._12_4_;
            auVar180._16_4_ = local_800._16_4_ * auVar25._16_4_;
            auVar180._20_4_ = local_800._20_4_ * auVar25._20_4_;
            auVar180._24_4_ = local_800._24_4_ * auVar25._24_4_;
            auVar180._28_4_ = 0;
            auVar113 = vfmsub231ps_fma(auVar180,local_7c0,auVar24);
            auVar113 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar113));
            auVar230 = ZEXT3264(auVar127);
            auVar181._0_4_ = auVar155._0_4_ * auVar127._0_4_;
            auVar181._4_4_ = auVar155._4_4_ * auVar127._4_4_;
            auVar181._8_4_ = auVar155._8_4_ * auVar127._8_4_;
            auVar181._12_4_ = auVar155._12_4_ * auVar127._12_4_;
            auVar181._16_4_ = auVar155._16_4_ * auVar127._16_4_;
            auVar181._20_4_ = auVar155._20_4_ * auVar127._20_4_;
            auVar181._24_4_ = auVar155._24_4_ * auVar127._24_4_;
            auVar181._28_4_ = 0;
            auVar11 = vfmsub231ps_fma(auVar181,auVar117,auVar123);
            auVar79._4_4_ = auVar131._4_4_ * auVar123._4_4_;
            auVar79._0_4_ = auVar131._0_4_ * auVar123._0_4_;
            auVar79._8_4_ = auVar131._8_4_ * auVar123._8_4_;
            auVar79._12_4_ = auVar131._12_4_ * auVar123._12_4_;
            auVar79._16_4_ = auVar131._16_4_ * auVar123._16_4_;
            auVar79._20_4_ = auVar131._20_4_ * auVar123._20_4_;
            auVar79._24_4_ = auVar131._24_4_ * auVar123._24_4_;
            auVar79._28_4_ = auVar123._28_4_;
            auVar195 = vfmsub231ps_fma(auVar79,auVar182,auVar155);
            auVar80._4_4_ = auVar117._4_4_ * auVar182._4_4_;
            auVar80._0_4_ = auVar117._0_4_ * auVar182._0_4_;
            auVar80._8_4_ = auVar117._8_4_ * auVar182._8_4_;
            auVar80._12_4_ = auVar117._12_4_ * auVar182._12_4_;
            auVar80._16_4_ = auVar117._16_4_ * auVar182._16_4_;
            auVar80._20_4_ = auVar117._20_4_ * auVar182._20_4_;
            auVar80._24_4_ = auVar117._24_4_ * auVar182._24_4_;
            auVar80._28_4_ = auVar182._28_4_;
            auVar23 = vfmsub231ps_fma(auVar80,auVar131,auVar127);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar23),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
            auVar195 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar195));
            auVar127 = vmaxps_avx(ZEXT1632(auVar113),ZEXT1632(auVar195));
            auVar127 = vcmpps_avx(auVar127,ZEXT832(0) << 0x20,2);
            auVar11 = vpackssdw_avx(auVar127._0_16_,auVar127._16_16_);
            auVar168 = vpand_avx(auVar11,auVar168);
            auVar127 = vpmovsxwd_avx2(auVar168);
            if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar127 >> 0x7f,0) == '\0') &&
                  (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar127 >> 0xbf,0) == '\0') &&
                (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar127[0x1f]) {
LAB_0183d8ee:
              auVar164._8_8_ = uStack_638;
              auVar164._0_8_ = local_640;
              auVar164._16_8_ = uStack_630;
              auVar164._24_8_ = uStack_628;
            }
            else {
              auVar81._4_4_ = auVar155._4_4_ * auVar25._4_4_;
              auVar81._0_4_ = auVar155._0_4_ * auVar25._0_4_;
              auVar81._8_4_ = auVar155._8_4_ * auVar25._8_4_;
              auVar81._12_4_ = auVar155._12_4_ * auVar25._12_4_;
              auVar81._16_4_ = auVar155._16_4_ * auVar25._16_4_;
              auVar81._20_4_ = auVar155._20_4_ * auVar25._20_4_;
              auVar81._24_4_ = auVar155._24_4_ * auVar25._24_4_;
              auVar81._28_4_ = auVar127._28_4_;
              auVar165 = vfmsub231ps_fma(auVar81,auVar131,auVar24);
              auVar191._0_4_ = auVar24._0_4_ * auVar117._0_4_;
              auVar191._4_4_ = auVar24._4_4_ * auVar117._4_4_;
              auVar191._8_4_ = auVar24._8_4_ * auVar117._8_4_;
              auVar191._12_4_ = auVar24._12_4_ * auVar117._12_4_;
              auVar191._16_4_ = auVar24._16_4_ * auVar117._16_4_;
              auVar191._20_4_ = auVar24._20_4_ * auVar117._20_4_;
              auVar191._24_4_ = auVar24._24_4_ * auVar117._24_4_;
              auVar191._28_4_ = 0;
              auVar115 = vfmsub231ps_fma(auVar191,auVar136,auVar155);
              auVar82._4_4_ = auVar136._4_4_ * auVar131._4_4_;
              auVar82._0_4_ = auVar136._0_4_ * auVar131._0_4_;
              auVar82._8_4_ = auVar136._8_4_ * auVar131._8_4_;
              auVar82._12_4_ = auVar136._12_4_ * auVar131._12_4_;
              auVar82._16_4_ = auVar136._16_4_ * auVar131._16_4_;
              auVar82._20_4_ = auVar136._20_4_ * auVar131._20_4_;
              auVar82._24_4_ = auVar136._24_4_ * auVar131._24_4_;
              auVar82._28_4_ = auVar131._28_4_;
              auVar184 = vfmsub231ps_fma(auVar82,auVar117,auVar25);
              auVar219 = ZEXT1664(auVar184);
              auVar11 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar115),ZEXT1632(auVar184));
              auVar23 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar165),ZEXT832(0) << 0x20);
              auVar127 = vrcpps_avx(ZEXT1632(auVar23));
              auVar229._8_4_ = 0x3f800000;
              auVar229._0_8_ = 0x3f8000003f800000;
              auVar229._12_4_ = 0x3f800000;
              auVar229._16_4_ = 0x3f800000;
              auVar229._20_4_ = 0x3f800000;
              auVar229._24_4_ = 0x3f800000;
              auVar229._28_4_ = 0x3f800000;
              auVar230 = ZEXT3264(auVar229);
              auVar11 = vfnmadd213ps_fma(auVar127,ZEXT1632(auVar23),auVar229);
              auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar127,auVar127);
              auVar83._4_4_ = auVar184._4_4_ * local_800._4_4_;
              auVar83._0_4_ = auVar184._0_4_ * local_800._0_4_;
              auVar83._8_4_ = auVar184._8_4_ * local_800._8_4_;
              auVar83._12_4_ = auVar184._12_4_ * local_800._12_4_;
              auVar83._16_4_ = local_800._16_4_ * 0.0;
              auVar83._20_4_ = local_800._20_4_ * 0.0;
              auVar83._24_4_ = local_800._24_4_ * 0.0;
              auVar83._28_4_ = auVar25._28_4_;
              auVar115 = vfmadd231ps_fma(auVar83,ZEXT1632(auVar115),local_7c0);
              auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),ZEXT1632(auVar165),auVar125);
              fVar217 = auVar11._0_4_;
              fVar220 = auVar11._4_4_;
              fVar221 = auVar11._8_4_;
              fVar222 = auVar11._12_4_;
              auVar182 = ZEXT1632(CONCAT412(fVar222 * auVar115._12_4_,
                                            CONCAT48(fVar221 * auVar115._8_4_,
                                                     CONCAT44(fVar220 * auVar115._4_4_,
                                                              fVar217 * auVar115._0_4_))));
              uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar163._4_4_ = uVar111;
              auVar163._0_4_ = uVar111;
              auVar163._8_4_ = uVar111;
              auVar163._12_4_ = uVar111;
              auVar163._16_4_ = uVar111;
              auVar163._20_4_ = uVar111;
              auVar163._24_4_ = uVar111;
              auVar163._28_4_ = uVar111;
              auVar125 = vcmpps_avx(local_4e0,auVar182,2);
              auVar127 = vcmpps_avx(auVar182,auVar163,2);
              auVar125 = vandps_avx(auVar127,auVar125);
              auVar11 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
              auVar168 = vpand_avx(auVar168,auVar11);
              auVar125 = vpmovsxwd_avx2(auVar168);
              if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar125 >> 0x7f,0) == '\0') &&
                    (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar125 >> 0xbf,0) == '\0') &&
                  (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar125[0x1f]) goto LAB_0183d8ee;
              auVar125 = vcmpps_avx(ZEXT1632(auVar23),ZEXT832(0) << 0x20,4);
              auVar11 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
              auVar168 = vpand_avx(auVar168,auVar11);
              auVar125 = vpmovsxwd_avx2(auVar168);
              auVar164._8_8_ = uStack_638;
              auVar164._0_8_ = local_640;
              auVar164._16_8_ = uStack_630;
              auVar164._24_8_ = uStack_628;
              if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar125 >> 0x7f,0) != '\0') ||
                    (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar125 >> 0xbf,0) != '\0') ||
                  (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar125[0x1f] < '\0') {
                auVar123 = ZEXT1632(CONCAT412(fVar222 * auVar113._12_4_,
                                              CONCAT48(fVar221 * auVar113._8_4_,
                                                       CONCAT44(fVar220 * auVar113._4_4_,
                                                                fVar217 * auVar113._0_4_))));
                auVar84._28_4_ = SUB84(uStack_628,4);
                auVar84._0_28_ =
                     ZEXT1628(CONCAT412(fVar222 * auVar195._12_4_,
                                        CONCAT48(fVar221 * auVar195._8_4_,
                                                 CONCAT44(fVar220 * auVar195._4_4_,
                                                          fVar217 * auVar195._0_4_))));
                auVar207._8_4_ = 0x3f800000;
                auVar207._0_8_ = 0x3f8000003f800000;
                auVar207._12_4_ = 0x3f800000;
                auVar207._16_4_ = 0x3f800000;
                auVar207._20_4_ = 0x3f800000;
                auVar207._24_4_ = 0x3f800000;
                auVar207._28_4_ = 0x3f800000;
                auVar127 = vsubps_avx(auVar207,auVar123);
                local_120 = vblendvps_avx(auVar127,auVar123,auVar26);
                auVar127 = vsubps_avx(auVar207,auVar84);
                local_520 = vblendvps_avx(auVar127,auVar84,auVar26);
                auVar164 = auVar125;
                local_620 = auVar182;
              }
            }
            auVar199 = ZEXT3264(CONCAT428(fStack_744,
                                          CONCAT424(fStack_748,
                                                    CONCAT420(fStack_74c,
                                                              CONCAT416(fStack_750,
                                                                        CONCAT412(fStack_754,
                                                                                  CONCAT48(
                                                  fStack_758,CONCAT44(fStack_75c,local_760))))))));
            if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar164 >> 0x7f,0) != '\0') ||
                  (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0xbf,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar164[0x1f] < '\0') {
              auVar125 = vsubps_avx(ZEXT1632(auVar22),auVar126);
              auVar168 = vfmadd213ps_fma(auVar125,local_120,auVar126);
              fVar217 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar85._4_4_ = (auVar168._4_4_ + auVar168._4_4_) * fVar217;
              auVar85._0_4_ = (auVar168._0_4_ + auVar168._0_4_) * fVar217;
              auVar85._8_4_ = (auVar168._8_4_ + auVar168._8_4_) * fVar217;
              auVar85._12_4_ = (auVar168._12_4_ + auVar168._12_4_) * fVar217;
              auVar85._16_4_ = fVar217 * 0.0;
              auVar85._20_4_ = fVar217 * 0.0;
              auVar85._24_4_ = fVar217 * 0.0;
              auVar85._28_4_ = fVar217;
              auVar125 = vcmpps_avx(local_620,auVar85,6);
              auVar127 = auVar164 & auVar125;
              if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar127 >> 0x7f,0) != '\0') ||
                    (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar127 >> 0xbf,0) != '\0') ||
                  (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar127[0x1f] < '\0') {
                auVar139._8_4_ = 0xbf800000;
                auVar139._0_8_ = 0xbf800000bf800000;
                auVar139._12_4_ = 0xbf800000;
                auVar139._16_4_ = 0xbf800000;
                auVar139._20_4_ = 0xbf800000;
                auVar139._24_4_ = 0xbf800000;
                auVar139._28_4_ = 0xbf800000;
                auVar159._8_4_ = 0x40000000;
                auVar159._0_8_ = 0x4000000040000000;
                auVar159._12_4_ = 0x40000000;
                auVar159._16_4_ = 0x40000000;
                auVar159._20_4_ = 0x40000000;
                auVar159._24_4_ = 0x40000000;
                auVar159._28_4_ = 0x40000000;
                auVar168 = vfmadd213ps_fma(local_520,auVar159,auVar139);
                local_420 = local_120;
                local_400 = ZEXT1632(auVar168);
                local_3e0 = local_620;
                pGVar20 = (context->scene->geometries).items[uVar104].ptr;
                local_520 = local_400;
                if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  local_6a0 = vandps_avx(auVar125,auVar164);
                  fVar217 = (float)local_3c0;
                  local_340[0] = (fVar217 + local_120._0_4_ + 0.0) * local_160;
                  local_340[1] = (fVar217 + local_120._4_4_ + 1.0) * fStack_15c;
                  local_340[2] = (fVar217 + local_120._8_4_ + 2.0) * fStack_158;
                  local_340[3] = (fVar217 + local_120._12_4_ + 3.0) * fStack_154;
                  fStack_330 = (fVar217 + local_120._16_4_ + 4.0) * fStack_150;
                  fStack_32c = (fVar217 + local_120._20_4_ + 5.0) * fStack_14c;
                  fStack_328 = (fVar217 + local_120._24_4_ + 6.0) * fStack_148;
                  fStack_324 = fVar217 + local_120._28_4_ + 7.0;
                  local_520._0_8_ = auVar168._0_8_;
                  local_520._8_8_ = auVar168._8_8_;
                  local_320 = local_520._0_8_;
                  uStack_318 = local_520._8_8_;
                  uStack_310 = 0;
                  uStack_308 = 0;
                  local_300 = local_620;
                  auVar140._8_4_ = 0x7f800000;
                  auVar140._0_8_ = 0x7f8000007f800000;
                  auVar140._12_4_ = 0x7f800000;
                  auVar140._16_4_ = 0x7f800000;
                  auVar140._20_4_ = 0x7f800000;
                  auVar140._24_4_ = 0x7f800000;
                  auVar140._28_4_ = 0x7f800000;
                  auVar125 = vblendvps_avx(auVar140,local_620,local_6a0);
                  auVar127 = vshufps_avx(auVar125,auVar125,0xb1);
                  auVar127 = vminps_avx(auVar125,auVar127);
                  auVar182 = vshufpd_avx(auVar127,auVar127,5);
                  auVar127 = vminps_avx(auVar127,auVar182);
                  auVar182 = vpermpd_avx2(auVar127,0x4e);
                  auVar127 = vminps_avx(auVar127,auVar182);
                  auVar127 = vcmpps_avx(auVar125,auVar127,0);
                  auVar182 = local_6a0 & auVar127;
                  auVar125 = local_6a0;
                  if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar182 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar182 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar182 >> 0x7f,0) != '\0') ||
                        (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar182 >> 0xbf,0) != '\0') ||
                      (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar182[0x1f] < '\0') {
                    auVar125 = vandps_avx(auVar127,local_6a0);
                  }
                  uVar106 = vmovmskps_avx(auVar125);
                  uVar8 = 0;
                  for (; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x80000000) {
                    uVar8 = uVar8 + 1;
                  }
                  uVar107 = (ulong)uVar8;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar217 = local_340[uVar107];
                    uVar111 = *(undefined4 *)((long)&local_320 + uVar107 * 4);
                    fVar220 = 1.0 - fVar217;
                    auVar168 = ZEXT416((uint)(fVar217 * fVar220 * 4.0));
                    auVar22 = vfnmsub213ss_fma(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),
                                               auVar168);
                    auVar168 = vfmadd213ss_fma(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),
                                               auVar168);
                    fVar220 = fVar220 * -fVar220 * 0.5;
                    fVar221 = auVar22._0_4_ * 0.5;
                    fVar222 = auVar168._0_4_ * 0.5;
                    fVar223 = fVar217 * fVar217 * 0.5;
                    auVar169._0_4_ = fVar223 * local_8e0;
                    auVar169._4_4_ = fVar223 * fStack_8dc;
                    auVar169._8_4_ = fVar223 * fStack_8d8;
                    auVar169._12_4_ = fVar223 * fStack_8d4;
                    auVar147._4_4_ = fVar222;
                    auVar147._0_4_ = fVar222;
                    auVar147._8_4_ = fVar222;
                    auVar147._12_4_ = fVar222;
                    auVar168 = vfmadd132ps_fma(auVar147,auVar169,auVar12);
                    auVar170._4_4_ = fVar221;
                    auVar170._0_4_ = fVar221;
                    auVar170._8_4_ = fVar221;
                    auVar170._12_4_ = fVar221;
                    auVar168 = vfmadd132ps_fma(auVar170,auVar168,auVar13);
                    auVar148._4_4_ = fVar220;
                    auVar148._0_4_ = fVar220;
                    auVar148._8_4_ = fVar220;
                    auVar148._12_4_ = fVar220;
                    auVar168 = vfmadd132ps_fma(auVar148,auVar168,auVar14);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar107 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar168._0_4_;
                    uVar216 = vextractps_avx(auVar168,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar216;
                    uVar216 = vextractps_avx(auVar168,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar216;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar217;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar111;
                    *(uint *)(ray + k * 4 + 0x220) = uVar19;
                    *(uint *)(ray + k * 4 + 0x240) = uVar104;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
                    _local_5e0 = auVar27;
                    local_3bc = iVar105;
                    local_3b0 = uVar194;
                    uStack_3a8 = uVar95;
                    local_3a0 = uVar96;
                    uStack_398 = uVar97;
                    local_390 = uVar98;
                    uStack_388 = uVar99;
                    local_380 = uVar100;
                    uStack_378 = uVar101;
                    while( true ) {
                      fVar217 = local_340[uVar107];
                      auVar114._4_4_ = fVar217;
                      auVar114._0_4_ = fVar217;
                      auVar114._8_4_ = fVar217;
                      auVar114._12_4_ = fVar217;
                      local_220._16_4_ = fVar217;
                      local_220._0_16_ = auVar114;
                      local_220._20_4_ = fVar217;
                      local_220._24_4_ = fVar217;
                      local_220._28_4_ = fVar217;
                      local_200 = *(undefined4 *)((long)&local_320 + uVar107 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_300 + uVar107 * 4);
                      fVar221 = 1.0 - fVar217;
                      auVar168 = ZEXT416((uint)(fVar217 * fVar221 * 4.0));
                      auVar22 = vfnmsub213ss_fma(auVar114,auVar114,auVar168);
                      auVar168 = vfmadd213ss_fma(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),
                                                 auVar168);
                      fVar220 = auVar168._0_4_ * 0.5;
                      fVar217 = fVar217 * fVar217 * 0.5;
                      auVar171._0_4_ = fVar217 * local_8e0;
                      auVar171._4_4_ = fVar217 * fStack_8dc;
                      auVar171._8_4_ = fVar217 * fStack_8d8;
                      auVar171._12_4_ = fVar217 * fStack_8d4;
                      auVar149._4_4_ = fVar220;
                      auVar149._0_4_ = fVar220;
                      auVar149._8_4_ = fVar220;
                      auVar149._12_4_ = fVar220;
                      auVar168 = vfmadd132ps_fma(auVar149,auVar171,auVar15);
                      fVar217 = auVar22._0_4_ * 0.5;
                      auVar172._4_4_ = fVar217;
                      auVar172._0_4_ = fVar217;
                      auVar172._8_4_ = fVar217;
                      auVar172._12_4_ = fVar217;
                      auVar168 = vfmadd132ps_fma(auVar172,auVar168,auVar16);
                      local_830.context = context->user;
                      fVar217 = fVar221 * -fVar221 * 0.5;
                      auVar150._4_4_ = fVar217;
                      auVar150._0_4_ = fVar217;
                      auVar150._8_4_ = fVar217;
                      auVar150._12_4_ = fVar217;
                      auVar22 = vfmadd132ps_fma(auVar150,auVar168,auVar17);
                      local_280 = auVar22._0_4_;
                      uStack_27c = local_280;
                      uStack_278 = local_280;
                      uStack_274 = local_280;
                      uStack_270 = local_280;
                      uStack_26c = local_280;
                      uStack_268 = local_280;
                      uStack_264 = local_280;
                      auVar168 = vmovshdup_avx(auVar22);
                      local_260 = auVar168._0_8_;
                      uStack_258 = local_260;
                      uStack_250 = local_260;
                      uStack_248 = local_260;
                      auVar168 = vshufps_avx(auVar22,auVar22,0xaa);
                      auVar151._0_8_ = auVar168._0_8_;
                      auVar151._8_8_ = auVar151._0_8_;
                      auVar160._16_8_ = auVar151._0_8_;
                      auVar160._0_16_ = auVar151;
                      auVar160._24_8_ = auVar151._0_8_;
                      local_240 = auVar160;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = CONCAT44(uStack_13c,local_140);
                      uStack_1d8 = CONCAT44(uStack_134,uStack_138);
                      uStack_1d0 = CONCAT44(uStack_12c,uStack_130);
                      uStack_1c8 = CONCAT44(uStack_124,uStack_128);
                      local_1c0._4_4_ = uStack_59c;
                      local_1c0._0_4_ = local_5a0;
                      local_1c0._8_4_ = uStack_598;
                      local_1c0._12_4_ = uStack_594;
                      local_1c0._16_4_ = uStack_590;
                      local_1c0._20_4_ = uStack_58c;
                      local_1c0._24_4_ = uStack_588;
                      local_1c0._28_4_ = uStack_584;
                      auVar125 = vpcmpeqd_avx2(local_1c0,local_1c0);
                      local_7c8[1] = auVar125;
                      *local_7c8 = auVar125;
                      local_1a0 = (local_830.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_830.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_680 = local_2e0;
                      local_830.valid = (int *)local_680;
                      local_830.geometryUserPtr = pGVar20->userPtr;
                      local_830.hit = (RTCHitN *)&local_280;
                      local_830.N = 8;
                      local_830.ray = (RTCRayN *)ray;
                      if (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar160 = ZEXT1632(auVar151);
                        auVar219 = ZEXT1664(auVar219._0_16_);
                        auVar230 = ZEXT1664(auVar230._0_16_);
                        (*pGVar20->intersectionFilterN)(&local_830);
                      }
                      auVar127 = vpcmpeqd_avx2(local_680,_DAT_01faff00);
                      auVar182 = vpcmpeqd_avx2(auVar160,auVar160);
                      auVar125 = auVar182 & ~auVar127;
                      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar125 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar125 >> 0x7f,0) == '\0') &&
                            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar125 >> 0xbf,0) == '\0') &&
                          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar125[0x1f]) {
                        auVar127 = auVar127 ^ auVar182;
                      }
                      else {
                        p_Var21 = context->args->filter;
                        if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar182 = ZEXT1632(auVar182._0_16_);
                          auVar219 = ZEXT1664(auVar219._0_16_);
                          auVar230 = ZEXT1664(auVar230._0_16_);
                          (*p_Var21)(&local_830);
                        }
                        auVar123 = vpcmpeqd_avx2(local_680,
                                                 SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                        auVar182 = vpcmpeqd_avx2(auVar182,auVar182);
                        auVar127 = auVar123 ^ auVar182;
                        auVar125 = auVar182 & ~auVar123;
                        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar125 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar125 >> 0x7f,0) != '\0')
                              || (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar125 >> 0xbf,0) != '\0') ||
                            (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar125[0x1f] < '\0') {
                          auVar141._0_4_ = auVar123._0_4_ ^ auVar182._0_4_;
                          auVar141._4_4_ = auVar123._4_4_ ^ auVar182._4_4_;
                          auVar141._8_4_ = auVar123._8_4_ ^ auVar182._8_4_;
                          auVar141._12_4_ = auVar123._12_4_ ^ auVar182._12_4_;
                          auVar141._16_4_ = auVar123._16_4_ ^ auVar182._16_4_;
                          auVar141._20_4_ = auVar123._20_4_ ^ auVar182._20_4_;
                          auVar141._24_4_ = auVar123._24_4_ ^ auVar182._24_4_;
                          auVar141._28_4_ = auVar123._28_4_ ^ auVar182._28_4_;
                          auVar125 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])local_830.hit);
                          *(undefined1 (*) [32])(local_830.ray + 0x180) = auVar125;
                          auVar125 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                              (local_830.hit + 0x20));
                          *(undefined1 (*) [32])(local_830.ray + 0x1a0) = auVar125;
                          auVar125 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                              (local_830.hit + 0x40));
                          *(undefined1 (*) [32])(local_830.ray + 0x1c0) = auVar125;
                          auVar125 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                              (local_830.hit + 0x60));
                          *(undefined1 (*) [32])(local_830.ray + 0x1e0) = auVar125;
                          auVar125 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                              (local_830.hit + 0x80));
                          *(undefined1 (*) [32])(local_830.ray + 0x200) = auVar125;
                          auVar125 = vpmaskmovd_avx2(auVar141,*(undefined1 (*) [32])
                                                               (local_830.hit + 0xa0));
                          *(undefined1 (*) [32])(local_830.ray + 0x220) = auVar125;
                          auVar125 = vpmaskmovd_avx2(auVar141,*(undefined1 (*) [32])
                                                               (local_830.hit + 0xc0));
                          *(undefined1 (*) [32])(local_830.ray + 0x240) = auVar125;
                          auVar125 = vpmaskmovd_avx2(auVar141,*(undefined1 (*) [32])
                                                               (local_830.hit + 0xe0));
                          *(undefined1 (*) [32])(local_830.ray + 0x260) = auVar125;
                          auVar125 = vpmaskmovd_avx2(auVar141,*(undefined1 (*) [32])
                                                               (local_830.hit + 0x100));
                          *(undefined1 (*) [32])(local_830.ray + 0x280) = auVar125;
                        }
                      }
                      auVar125 = local_620;
                      if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar127 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar127 >> 0x7f,0) == '\0') &&
                            (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar127 >> 0xbf,0) == '\0') &&
                          (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar127[0x1f]) {
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar111;
                      }
                      else {
                        uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
                      }
                      *(undefined4 *)(local_6a0 + uVar107 * 4) = 0;
                      auVar128._4_4_ = uVar111;
                      auVar128._0_4_ = uVar111;
                      auVar128._8_4_ = uVar111;
                      auVar128._12_4_ = uVar111;
                      auVar128._16_4_ = uVar111;
                      auVar128._20_4_ = uVar111;
                      auVar128._24_4_ = uVar111;
                      auVar128._28_4_ = uVar111;
                      auVar182 = vcmpps_avx(auVar125,auVar128,2);
                      auVar127 = vandps_avx(auVar182,local_6a0);
                      local_6a0 = local_6a0 & auVar182;
                      if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_6a0 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                            (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                          (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_6a0[0x1f]) break;
                      auVar142._8_4_ = 0x7f800000;
                      auVar142._0_8_ = 0x7f8000007f800000;
                      auVar142._12_4_ = 0x7f800000;
                      auVar142._16_4_ = 0x7f800000;
                      auVar142._20_4_ = 0x7f800000;
                      auVar142._24_4_ = 0x7f800000;
                      auVar142._28_4_ = 0x7f800000;
                      auVar125 = vblendvps_avx(auVar142,auVar125,auVar127);
                      auVar182 = vshufps_avx(auVar125,auVar125,0xb1);
                      auVar182 = vminps_avx(auVar125,auVar182);
                      auVar123 = vshufpd_avx(auVar182,auVar182,5);
                      auVar182 = vminps_avx(auVar182,auVar123);
                      auVar123 = vpermpd_avx2(auVar182,0x4e);
                      auVar182 = vminps_avx(auVar182,auVar123);
                      auVar182 = vcmpps_avx(auVar125,auVar182,0);
                      auVar123 = auVar127 & auVar182;
                      auVar125 = auVar127;
                      if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar123 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar123 >> 0x7f,0) != '\0') ||
                            (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar123 >> 0xbf,0) != '\0') ||
                          (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar123[0x1f] < '\0') {
                        auVar125 = vandps_avx(auVar182,auVar127);
                      }
                      uVar106 = vmovmskps_avx(auVar125);
                      uVar8 = 0;
                      for (; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x80000000) {
                        uVar8 = uVar8 + 1;
                      }
                      uVar107 = (ulong)uVar8;
                      local_6a0 = auVar127;
                    }
                    auVar199 = ZEXT3264(CONCAT428(fStack_744,
                                                  CONCAT424(fStack_748,
                                                            CONCAT420(fStack_74c,
                                                                      CONCAT416(fStack_750,
                                                                                CONCAT412(fStack_754
                                                                                          ,CONCAT48(
                                                  fStack_758,CONCAT44(fStack_75c,local_760))))))));
                  }
                }
              }
            }
          }
          lVar110 = lVar110 + 8;
        } while ((int)lVar110 < iVar105);
      }
      uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar124._4_4_ = uVar111;
      auVar124._0_4_ = uVar111;
      auVar124._8_4_ = uVar111;
      auVar124._12_4_ = uVar111;
      auVar124._16_4_ = uVar111;
      auVar124._20_4_ = uVar111;
      auVar124._24_4_ = uVar111;
      auVar124._28_4_ = uVar111;
      auVar125 = vcmpps_avx(local_80,auVar124,2);
      uVar104 = vmovmskps_avx(auVar125);
      uVar104 = (uint)uVar109 & uVar104;
    } while (uVar104 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }